

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

void search_tx_type(AV1_COMP *cpi,MACROBLOCK *x,int plane,int block,int blk_row,int blk_col,
                   BLOCK_SIZE plane_bsize,TX_SIZE tx_size,TXB_CTX *txb_ctx,
                   FAST_TX_SEARCH_MODE ftxs_mode,int skip_trellis,int64_t ref_best_rd,
                   RD_STATS *best_rd_stats)

{
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  CommonQuantParams *pCVar1;
  byte bVar2;
  short sVar3;
  MB_MODE_INFO *pMVar4;
  tran_low_t *ptVar5;
  MB_MODE_INFO *pMVar6;
  uint16_t *puVar7;
  NN_CONFIG *pNVar8;
  byte bVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  _Bool _Var12;
  ushort uVar13;
  int i_1;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint64_t uVar20;
  RD_STATS *pRVar21;
  ushort *puVar22;
  int64_t iVar23;
  byte bVar24;
  byte bVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  int64_t *piVar29;
  char cVar30;
  uint8_t uVar31;
  TX_TYPE TVar32;
  int idx;
  int iVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  int (*paiVar37) [16];
  long lVar38;
  int16_t *piVar39;
  uint *puVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  long lVar44;
  ulong uVar45;
  int16_t *piVar46;
  uint8_t tx_type;
  undefined7 uVar50;
  ENTROPY_CONTEXT *t_left;
  QUANT_PARAM *pQVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar51;
  uint uVar52;
  PREDICTION_MODE *pPVar53;
  int i;
  uint uVar54;
  ulong uVar55;
  ulong uVar56;
  uint uVar57;
  uint uVar58;
  long lVar59;
  ulong uVar60;
  tran_low_t *ptVar61;
  uint uVar62;
  undefined4 uVar63;
  NN_CONFIG *pNVar64;
  bool bVar65;
  bool bVar66;
  uint uVar67;
  float fVar68;
  float fVar69;
  double dVar70;
  int iVar71;
  int iVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [16];
  int iVar79;
  int iVar80;
  int iVar81;
  int aiVar76 [4];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  undefined1 auVar86 [16];
  float fVar87;
  float fVar88;
  undefined1 in_XMM5 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  uint uVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  uint uVar95;
  float fVar96;
  uint uVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float local_7b8;
  uint local_7a0;
  undefined1 local_788 [16];
  ulong local_778;
  undefined8 uStack_770;
  byte local_748;
  ulong local_738;
  int rate_cost;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined1 local_708 [16];
  undefined1 local_6f8 [16];
  macroblock_plane *local_6e8;
  ulong local_6e0;
  undefined1 local_6d8 [16];
  ulong local_6c8;
  undefined4 uStack_6c0;
  undefined4 uStack_6bc;
  ulong local_6b8;
  uint local_6b0;
  uint block_mse_q8;
  int64_t dist;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  ulong local_668;
  undefined8 uStack_660;
  int16_t *local_658;
  undefined8 uStack_650;
  TxfmParam txfm_param_2;
  ulong local_600;
  undefined8 local_5f0;
  ENTROPY_CONTEXT ctxl [32];
  uint7 uStack_5c7;
  long local_598;
  int64_t dist_1;
  undefined1 local_578 [16];
  int idx_h [4];
  int idx_v [4];
  TxfmParam txfm_param;
  long local_4f8;
  tran_low_t *local_4f0;
  int txk_map [16];
  int skip_h [4];
  int skip_v [4];
  int64_t local_440;
  QUANT_PARAM quant_param;
  
  local_788._8_8_ = local_788._0_8_;
  pMVar4 = *(x->e_mbd).mi;
  rate_cost = 0;
  if (plane == 0) {
    local_4f8 = (long)((x->e_mbd).tx_type_map_stride * blk_row + blk_col);
  }
  else {
    local_4f8 = 0;
  }
  local_6e8 = x->plane + plane;
  ptVar5 = x->plane[plane].dqcoeff;
  local_4f0 = x->dqcoeff_buf;
  best_rd_stats->rate = 0x7fffffff;
  best_rd_stats->zero_rate = 0;
  best_rd_stats->dist = 0x7fffffffffffffff;
  best_rd_stats->rdcost = 0x7fffffffffffffff;
  best_rd_stats->sse = 0x7fffffffffffffff;
  best_rd_stats->skip_txfm = '\0';
  local_5f0 = CONCAT71(local_5f0._1_7_,
                       (cpi->optimize_seg_arr[*(ushort *)&pMVar4->field_0xa7 & 7] & 0xfd) == 0);
  txk_map[0xc] = 0xc;
  txk_map[0xd] = 0xd;
  txk_map[0xe] = 0xe;
  txk_map[0xf] = 0xf;
  txk_map[8] = 8;
  txk_map[9] = 9;
  txk_map[10] = 10;
  txk_map[0xb] = 0xb;
  txk_map[4] = 4;
  txk_map[5] = 5;
  txk_map[6] = 6;
  txk_map[7] = 7;
  txk_map[0] = 0;
  txk_map[1] = 1;
  txk_map[2] = 2;
  txk_map[3] = 3;
  uVar26 = ((x->e_mbd).cur_buf)->flags;
  bVar24 = 3;
  if ((uVar26 & 8) != 0) {
    bVar24 = (char)(x->e_mbd).bd - 5;
  }
  cm = &cpi->common;
  xd = &x->e_mbd;
  iVar33 = (int)local_6e8->dequant_QTX[1];
  uVar55 = (ulong)tx_size;
  uVar28 = (ulong)plane_bsize;
  uVar14 = (uint)tx_size;
  if ((((x->txfm_search_params).predict_dc_level == 0) || ((0x3efefUL >> (uVar55 & 0x3f) & 1) == 0))
     || ((0x5f7efUL >> (uVar55 & 0x3f) & 1) == 0)) {
    t_left = (ENTROPY_CONTEXT *)0x0;
    uVar20 = av1_pixel_diff_dist(x,plane,blk_row,blk_col,plane_bsize,txsize_to_bsize[uVar55],
                                 &block_mse_q8);
    local_598 = 0x7fffffffffffffff;
    pRVar21 = (RD_STATS *)0x7fffffffffffffff;
LAB_002481aa:
    local_7a0 = 1;
    local_6e0 = CONCAT44(local_6e0._4_4_,(int)CONCAT71((int7)((ulong)pRVar21 >> 8),1));
    if ((cpi->sf).rt_sf.dct_only_palette_nonrd == 1) {
      uVar50 = (undefined7)((ulong)t_left >> 8);
      bVar66 = true;
    }
    else {
      pMVar6 = *(x->e_mbd).mi;
      cVar30 = (char)*(ushort *)&pMVar6->field_0xa7;
      uVar26 = (uint)*(ushort *)&pMVar6->field_0xa7;
      if (cVar30 < '\0') {
        pQVar47 = (QUANT_PARAM *)(ulong)(cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
        paiVar37 = (cpi->ppi->frame_probs).tx_type_probs[(long)pQVar47] + tx_size;
LAB_00248356:
        iVar17 = (x->txfm_search_params).default_inter_tx_type_prob_thresh;
        if (iVar17 == 0x7fffffff) {
          uVar67 = 1;
          bVar66 = true;
LAB_002483e0:
          uVar60 = 0x10;
          if (plane == 0) {
            uVar60 = (ulong)(byte)((x->rd_model != '\x01') << 4);
          }
          uVar34 = (ulong)uVar67;
        }
        else {
          uVar34 = 1;
          if (iVar17 == 0) {
            if ((-1 < cVar30) && (bVar66 = true, pMVar6->ref_frame[0] < '\x01')) goto LAB_0024838b;
            uVar60 = 0;
            bVar66 = true;
          }
          else {
            uVar60 = 0;
            bVar66 = true;
            if ((*paiVar37)[0] <= iVar17) {
              uVar34 = 1;
              uVar60 = 0;
              iVar15 = 0;
              do {
                iVar16 = (*paiVar37)[uVar34];
                iVar71 = iVar15;
                if (iVar15 < iVar16) {
                  iVar71 = iVar16;
                }
                uVar60 = uVar60 & 0xff;
                if (iVar15 < iVar16) {
                  uVar60 = uVar34 & 0xffffffff;
                }
                uVar34 = uVar34 + 1;
                iVar15 = iVar71;
              } while (uVar34 != 0x10);
              if (iVar71 <= iVar17 + 100) {
                uVar60 = 0x10;
                if (plane == 0) {
                  uVar60 = (ulong)(byte)((x->rd_model != '\x01') << 4);
                }
              }
              uVar34 = 1;
              bVar66 = true;
            }
          }
        }
      }
      else {
        pQVar47 = (QUANT_PARAM *)(ulong)(cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
        paiVar37 = (int (*) [16])(cpi->ppi->frame_probs).tx_type_probs[(long)pQVar47][tx_size];
        if ('\0' < pMVar6->ref_frame[0]) goto LAB_00248356;
        bVar66 = false;
        uVar34 = 0;
        uVar67 = 0;
        if ((x->txfm_search_params).use_default_intra_tx_type == 0) goto LAB_002483e0;
LAB_0024838b:
        uVar60 = 0;
        if ((tx_size < 3) &&
           ((x->e_mbd).lossless[uVar26 & 7] == 0 && cpi->use_screen_content_tools == 0)) {
          uVar60 = (ulong)(byte)intra_mode_to_tx_type__intra_mode_to_tx_type[pMVar6->mode];
        }
      }
      bVar65 = (cpi->common).features.reduced_tx_set_used;
      uVar56 = 0x61810L >> (tx_size & 0x3f);
      if ((0x61810UL >> (uVar55 & 0x3f) & 1) == 0) {
        if ((0x18608UL >> (uVar55 & 0x3f) & 1) == 0) {
          if (bVar65 == false) {
            uVar34 = (ulong)av1_ext_tx_set_lookup[0]
                            [(ulong)((0x60604UL >> (uVar55 & 0x3f) & 1) != 0) +
                             (ulong)(uint)((int)uVar34 * 2)];
          }
          else {
            uVar34 = (ulong)(byte)(((int)uVar34 == 0) + 1);
          }
        }
      }
      else {
        uVar34 = 0;
      }
      if (plane == 0) {
        local_600 = 0;
      }
      else {
        local_600 = 0;
        if ((uVar56 & 1) == 0) {
          uVar60 = 0;
          if ((x->e_mbd).lossless[uVar26 & 7] == 0) {
            if ((cVar30 < '\0') || ('\0' < pMVar6->ref_frame[0])) {
              bVar25 = (x->e_mbd).tx_type_map
                       [(blk_row << ((byte)(x->e_mbd).plane[1].subsampling_y & 0x1f)) *
                        (x->e_mbd).tx_type_map_stride +
                        (blk_col << ((byte)(x->e_mbd).plane[1].subsampling_x & 0x1f))];
              uVar67 = 1;
              if (-1 < cVar30) {
                uVar67 = (uint)('\0' < pMVar6->ref_frame[0]);
              }
            }
            else {
              bVar25 = intra_mode_to_tx_type__intra_mode_to_tx_type
                       [(byte)get_uv_mode_uv2y[pMVar6->uv_mode]];
              uVar67 = 0;
            }
            if ((0x18608UL >> (uVar55 & 0x3f) & 1) == 0) {
              if (bVar65 == false) {
                uVar67 = (uint)av1_ext_tx_set_lookup[0]
                               [(ulong)((0x60604UL >> (uVar55 & 0x3f) & 1) != 0) +
                                (ulong)(uVar67 * 2)];
              }
              else {
                uVar67 = (uint)(byte)((uVar67 == 0) + 1);
              }
            }
            uVar60 = (ulong)bVar25;
            local_600 = uVar60;
            if (*(int *)((long)av1_ext_tx_used[0] + uVar60 * 4 + (ulong)(uVar67 << 6)) == 0) {
              uVar60 = 0;
              local_600 = uVar60;
            }
          }
        }
        else {
          uVar60 = 0;
        }
      }
      if ((pMVar6->filter_intra_mode_info).use_filter_intra == '\0') {
        pPVar53 = &pMVar6->mode;
      }
      else {
        pPVar53 = "" + (pMVar6->filter_intra_mode_info).filter_intra_mode;
      }
      iVar17 = (cpi->sf).tx_sf.tx_type_search.use_reduced_intra_txset;
      cVar30 = (char)uVar34;
      puVar22 = av1_reduced_intra_tx_used_flag + *pPVar53;
      if (cVar30 != '\x03') {
        puVar22 = av1_ext_tx_used_flag + uVar34;
      }
      if (iVar17 == 0) {
        puVar22 = av1_ext_tx_used_flag + uVar34;
      }
      uVar13 = *puVar22;
      if (iVar17 == 2) {
        uVar13 = uVar13 & av1_derived_intra_tx_used_flag[*pPVar53];
      }
      uVar67 = (uint)uVar13;
      if ((((uVar56 & 1) == 0) && ((x->e_mbd).lossless[uVar26 & 7] == 0)) && (uVar13 != 1)) {
        if (bVar66) {
          if ((cpi->oxcf).txfm_cfg.use_inter_dct_only != false) goto LAB_00248adb;
        }
        else if ((cpi->oxcf).txfm_cfg.use_intra_dct_only == true) goto LAB_00248adb;
        uVar26 = uVar67 & 0xf;
        if ((cpi->oxcf).txfm_cfg.enable_flip_idtx != false) {
          uVar26 = uVar67;
        }
        if ((byte)uVar60 < 0x10) goto LAB_00248af2;
        if ((ftxs_mode & 1) != 0) {
          local_7a0 = uVar26 & 0xc01;
          goto LAB_00248afe;
        }
        lVar44 = (long)(cpi->sf).tx_sf.tx_type_search.prune_tx_type_using_stats;
        if (lVar44 != 0) {
          uVar67 = *(uint *)(lVar44 * 0x1c + 0x5111b4 + (long)pQVar47 * 4);
          pQVar47 = (QUANT_PARAM *)(ulong)uVar67;
          iVar17 = -1;
          lVar44 = 0;
          uVar19 = 0;
          uVar41 = 0;
          do {
            iVar15 = (*paiVar37)[lVar44];
            uVar57 = 1 << ((byte)lVar44 & 0x1f);
            uVar18 = (uint)lVar44;
            iVar16 = iVar15;
            if ((uVar26 >> ((uint)lVar44 & 0x1f) & 1) == 0) {
              uVar18 = uVar19;
              iVar16 = iVar17;
            }
            if (iVar15 <= iVar17) {
              uVar18 = uVar19;
              iVar16 = iVar17;
            }
            iVar17 = iVar16;
            uVar19 = uVar18;
            if ((int)uVar67 <= iVar15) {
              uVar57 = 0;
            }
            uVar41 = uVar41 | uVar57;
            lVar44 = lVar44 + 1;
          } while (lVar44 != 0x10);
          bVar25 = (byte)uVar19 & 0x1f;
          uVar67 = 0xffff;
          if (((uVar41 & 0xffff) >> (uVar19 & 0x1f) & 1) != 0) {
            uVar67 = -2 << bVar25 | 0xfffffffeU >> 0x20 - bVar25;
          }
          uVar26 = uVar26 & ~(uVar67 & uVar41);
        }
        iVar15 = 0;
        iVar16 = 0;
        iVar71 = 0;
        iVar72 = 0;
        iVar17 = 0x10;
        aiVar76 = quad_to_linear_1;
        do {
          auVar89 = pshuflw(in_XMM5,(undefined1  [16])aiVar76,0xfe);
          lVar44 = auVar89._0_8_;
          auVar93._0_4_ = uVar26 >> lVar44;
          auVar93._4_4_ = uVar26 >> lVar44;
          auVar93._8_4_ = uVar26 >> lVar44;
          auVar93._12_4_ = uVar26 >> lVar44;
          auVar89 = pshuflw(auVar89,(undefined1  [16])aiVar76,0x54);
          iVar79 = aiVar76[1];
          iVar80 = aiVar76[2];
          iVar81 = aiVar76[3];
          auVar90._0_8_ = aiVar76._8_8_;
          auVar90._8_4_ = iVar80;
          auVar90._12_4_ = iVar81;
          auVar94 = pshuflw(auVar93,auVar90,0xfe);
          in_XMM5 = pshuflw(auVar90,auVar90,0x54);
          iVar15 = iVar15 + (uVar26 >> auVar89._0_8_ & 1);
          iVar16 = iVar16 + (auVar93._4_4_ & 1);
          iVar71 = iVar71 + (uVar26 >> in_XMM5._0_8_ & 1);
          iVar72 = iVar72 + (uVar26 >> auVar94._0_8_ & 1);
          aiVar76[0] = aiVar76[0] + 4;
          aiVar76[1] = iVar79 + 4;
          aiVar76[2] = iVar80 + 4;
          aiVar76[3] = iVar81 + 4;
          iVar17 = iVar17 + -4;
        } while (iVar17 != 0);
        uVar67 = iVar72 + iVar16 + iVar71 + iVar15;
        local_6b8 = CONCAT44(local_6b8._4_4_,(int)uVar60);
        if ((uVar67 < 3) || ((cpi->sf).tx_sf.tx_type_search.prune_tx_type_est_rd == 0)) {
          uVar19 = (x->txfm_search_params).prune_2d_txfm_mode;
          local_7a0 = uVar26;
          if (((!bVar66 || (int)uVar19 < 1) ||
              ((uVar67 <= (uint)(uVar19 < 4) * 4 + 1 || ((byte)(cVar30 - 6U) < 0xfe)))) ||
             ((0x61e7UL >> (uVar55 & 0x3f) & 1) == 0)) goto LAB_00248afe;
          local_6f8._0_8_ =
               *(undefined8 *)((long)av1_tx_type_nnconfig_map_hor + (ulong)(uVar14 * 8));
          uVar67 = *(uint *)((long)tx_size_wide + (ulong)(uVar14 * 4));
          local_6c8 = CONCAT44(local_6c8._4_4_,uVar67 >> (~(byte)(0xa0e3L >> (tx_size & 0x3f)) & 1))
          ;
          uVar41 = *(uint *)((long)tx_size_high + (ulong)(uVar14 * 4));
          local_708._0_4_ = uVar41 >> (~(byte)(0x14163L >> (tx_size & 0x3f)) & 1);
          bVar25 = block_size_wide[uVar28];
          uVar56 = (ulong)bVar25;
          local_6d8._0_4_ = blk_row * (uint)bVar25 * 4;
          bVar66 = (0x6be9cUL >> (uVar55 & 0x3f) & 1) != 0;
          iVar17 = (int)uVar67 >> ((0x75f1cUL >> (uVar55 & 0x3f) & 1) != 0);
          pNVar8 = *(NN_CONFIG **)((long)av1_tx_type_nnconfig_map_ver + (ulong)(uVar14 * 8));
          local_658 = x->plane[0].src_diff;
          iVar15 = (int)uVar41 >> bVar66;
          uVar18 = iVar15 * iVar17;
          local_668 = CONCAT44(local_668._4_4_,blk_col * 4);
          pQVar47 = &quant_param;
          memset(pQVar47,0,(long)(int)uVar18 << 2);
          lVar44 = (long)(int)local_6d8._0_4_;
          piVar46 = local_658 + lVar44 + (int)local_668;
          local_6d8._0_8_ = piVar46;
          if ((0x75f1cUL >> (uVar55 & 0x3f) & 1) == 0) {
            uVar51 = 0;
            piVar39 = piVar46;
            do {
              uVar45 = 0;
              do {
                (&quant_param.log_scale)[(long)(int)(((uint)uVar51 >> bVar66) * iVar17) + uVar45] =
                     (&quant_param.log_scale)
                     [(long)(int)(((uint)uVar51 >> bVar66) * iVar17) + uVar45] +
                     (int)piVar39[uVar45] * (int)piVar39[uVar45];
                uVar45 = uVar45 + 1;
              } while (uVar67 != uVar45);
              uVar51 = uVar51 + 1;
              piVar39 = (int16_t *)((long)piVar39 + (ulong)((uint)bVar25 * 2));
            } while (uVar51 != uVar41);
          }
          else {
            piVar39 = local_658 + lVar44 + (long)(int)local_668 + 1;
            uVar51 = 0;
            do {
              uVar57 = ((uint)uVar51 >> bVar66) * iVar17;
              uVar45 = 0;
              do {
                *(int *)((long)&quant_param.log_scale + uVar45 * 2 + (ulong)uVar57 * 4) =
                     (int)piVar39[uVar45 - 1] * (int)piVar39[uVar45 - 1] +
                     *(int *)((long)&quant_param.log_scale + uVar45 * 2 + (ulong)uVar57 * 4) +
                     (int)piVar39[uVar45] * (int)piVar39[uVar45];
                uVar45 = uVar45 + 2;
              } while (uVar45 < uVar67);
              uVar51 = uVar51 + 1;
              piVar39 = (int16_t *)((long)piVar39 + (ulong)((uint)bVar25 * 2));
            } while (uVar51 != uVar41);
          }
          local_718 = uVar56;
          if ((int)uVar18 < 1) {
LAB_0024a72c:
            if (1 < iVar17) {
              fVar68 = 1.0 / (float)iVar17;
              lVar44 = (ulong)(iVar17 - 1) - 1;
              auVar77._8_4_ = (int)lVar44;
              auVar77._0_8_ = lVar44;
              auVar77._12_4_ = (int)((ulong)lVar44 >> 0x20);
              lVar44 = 0;
              auVar77 = auVar77 ^ _DAT_004cd030;
              auVar94 = _DAT_004d5360;
              auVar86 = _DAT_004cd020;
              do {
                auVar89 = auVar86 ^ _DAT_004cd030;
                iVar16 = auVar77._4_4_;
                if ((bool)(~(auVar89._4_4_ == iVar16 && auVar77._0_4_ < auVar89._0_4_ ||
                            iVar16 < auVar89._4_4_) & 1)) {
                  *(float *)(ctxl + lVar44) = fVar68;
                }
                if ((auVar89._12_4_ != auVar77._12_4_ || auVar89._8_4_ <= auVar77._8_4_) &&
                    auVar89._12_4_ <= auVar77._12_4_) {
                  *(float *)(ctxl + lVar44 + 4) = fVar68;
                }
                iVar71 = SUB164(auVar94 ^ _DAT_004cd030,4);
                if (iVar71 <= iVar16 &&
                    (iVar71 != iVar16 || SUB164(auVar94 ^ _DAT_004cd030,0) <= auVar77._0_4_)) {
                  *(float *)(ctxl + lVar44 + 8) = fVar68;
                  *(float *)(ctxl + lVar44 + 0xc) = fVar68;
                }
                lVar38 = auVar86._8_8_;
                auVar86._0_8_ = auVar86._0_8_ + 4;
                auVar86._8_8_ = lVar38 + 4;
                lVar38 = auVar94._8_8_;
                auVar94._0_8_ = auVar94._0_8_ + 4;
                auVar94._8_8_ = lVar38 + 4;
                lVar44 = lVar44 + 0x10;
              } while ((ulong)(iVar17 + 2U >> 2) << 4 != lVar44);
            }
            uVar18 = (uint)bVar25;
            pNVar64 = (NN_CONFIG *)local_6f8._0_8_;
            if (1 < iVar15) {
              fVar68 = 1.0 / (float)iVar15;
              lVar44 = (ulong)(iVar15 - 1) - 1;
              auVar75._8_4_ = (int)lVar44;
              auVar75._0_8_ = lVar44;
              auVar75._12_4_ = (int)((ulong)lVar44 >> 0x20);
              lVar44 = 0;
              auVar75 = auVar75 ^ _DAT_004cd030;
              auVar78 = _DAT_004d5360;
              auVar83 = _DAT_004cd020;
              do {
                auVar89 = auVar83 ^ _DAT_004cd030;
                iVar17 = auVar75._4_4_;
                if ((bool)(~(auVar89._4_4_ == iVar17 && auVar75._0_4_ < auVar89._0_4_ ||
                            iVar17 < auVar89._4_4_) & 1)) {
                  *(float *)(&txfm_param.tx_type + lVar44) = fVar68;
                }
                if ((auVar89._12_4_ != auVar75._12_4_ || auVar89._8_4_ <= auVar75._8_4_) &&
                    auVar89._12_4_ <= auVar75._12_4_) {
                  *(float *)((long)&txfm_param.lossless + lVar44) = fVar68;
                }
                iVar16 = SUB164(auVar78 ^ _DAT_004cd030,4);
                if (iVar16 <= iVar17 &&
                    (iVar16 != iVar17 || SUB164(auVar78 ^ _DAT_004cd030,0) <= auVar75._0_4_)) {
                  *(float *)((long)&txfm_param.bd + lVar44) = fVar68;
                  *(float *)((long)&txfm_param.is_hbd + lVar44) = fVar68;
                }
                lVar38 = auVar83._8_8_;
                auVar83._0_8_ = auVar83._0_8_ + 4;
                auVar83._8_8_ = lVar38 + 4;
                lVar38 = auVar78._8_8_;
                auVar78._0_8_ = auVar78._0_8_ + 4;
                auVar78._8_8_ = lVar38 + 4;
                lVar44 = lVar44 + 0x10;
              } while ((ulong)(iVar15 + 2U >> 2) << 4 != lVar44);
            }
          }
          else {
            uVar51 = 0;
            uVar56 = 0;
            do {
              uVar56 = uVar56 + (uint)(&quant_param.log_scale)[uVar51];
              uVar51 = uVar51 + 1;
            } while (uVar18 != uVar51);
            if (uVar56 == 0) goto LAB_0024a72c;
            local_658 = (int16_t *)((ulong)local_658 & 0xffffffff00000000);
            memset(ctxl,0,(long)(int)(iVar17 - 1U) * 4);
            uVar57 = iVar15 - 1;
            local_668 = CONCAT44(local_668._4_4_,uVar57);
            memset(&txfm_param,0,(long)(int)uVar57 * 4);
            uVar51 = (ulong)(iVar17 - 1U);
            if (1 < iVar15) {
              uVar45 = 0;
              do {
                fVar68 = *(float *)(&txfm_param.tx_type + uVar45 * 4);
                uVar48 = 0;
                uVar49 = uVar48;
                if (1 < iVar17) {
                  do {
                    fVar68 = fVar68 + (float)(uint)(&pQVar47->log_scale)[uVar48];
                    *(float *)(ctxl + uVar48 * 4) =
                         (float)(uint)(&pQVar47->log_scale)[uVar48] + *(float *)(ctxl + uVar48 * 4);
                    uVar48 = uVar48 + 1;
                    uVar49 = uVar51;
                  } while (uVar51 != uVar48);
                }
                *(float *)(&txfm_param.tx_type + uVar45 * 4) =
                     (float)(uint)(&quant_param.log_scale)[uVar45 * (long)iVar17 + uVar49] + fVar68;
                uVar45 = uVar45 + 1;
                pQVar47 = (QUANT_PARAM *)(&pQVar47->log_scale + iVar17);
              } while (uVar45 != uVar57);
              local_658 = (int16_t *)CONCAT44(local_658._4_4_,(int)local_668);
            }
            if (1 < iVar17) {
              uVar45 = 0;
              do {
                *(float *)(ctxl + uVar45 * 4) =
                     (float)(uint)(&quant_param.log_scale)[(long)((int)local_658 * iVar17) + uVar45]
                     + *(float *)(ctxl + uVar45 * 4);
                uVar45 = uVar45 + 1;
              } while (uVar51 != uVar45);
              uVar45 = 0;
              do {
                *(float *)(ctxl + uVar45 * 4) =
                     *(float *)(ctxl + uVar45 * 4) * (1.0 / (float)uVar56);
                uVar45 = uVar45 + 1;
              } while (uVar51 != uVar45);
            }
            uVar18 = (uint)local_718;
            piVar46 = (int16_t *)local_6d8._0_8_;
            pNVar64 = (NN_CONFIG *)local_6f8._0_8_;
            if (1 < iVar15) {
              uVar51 = 0;
              do {
                *(float *)(&txfm_param.tx_type + uVar51 * 4) =
                     *(float *)(&txfm_param.tx_type + uVar51 * 4) * (1.0 / (float)uVar56);
                uVar51 = uVar51 + 1;
              } while (uVar57 != uVar51);
            }
          }
          (*av1_get_horver_correlation_full)
                    (piVar46,uVar18,uVar67,uVar41,(float *)(ctxl + (long)(int)local_6c8 * 4 + -4),
                     (float *)(idx_v + (long)(int)local_708._0_4_ + 3));
          (*av1_nn_predict)((float *)ctxl,pNVar64,1,(float *)idx_v);
          (*av1_nn_predict)((float *)&txfm_param,pNVar8,1,(float *)idx_h);
          quant_param.log_scale = (int)((float)idx_v[0] * (float)idx_h[0]);
          quant_param.iqmatrix._0_4_ = (float)idx_v[0] * (float)idx_h[1];
          quant_param.xform_quant_idx = (int)((float)idx_v[0] * (float)idx_h[2]);
          quant_param._4_4_ = (float)idx_v[1] * (float)idx_h[0];
          quant_param.iqmatrix._4_4_ = (float)idx_v[1] * (float)idx_h[1];
          quant_param._36_4_ = (float)idx_v[1] * (float)idx_h[2];
          quant_param.qmatrix._0_4_ = (float)idx_v[2] * (float)idx_h[0];
          quant_param.use_quant_b_adapt = (int)((float)idx_v[2] * (float)idx_h[1]);
          quant_param.qmatrix._4_4_ = (float)idx_v[3] * (float)idx_h[0];
          quant_param.use_optimize_b = (int)((float)idx_v[3] * (float)idx_h[1]);
          (*av1_nn_fast_softmax_16)((float *)&quant_param,(float *)&quant_param);
          if (cVar30 == '\x04') {
            fVar68 = av1_tx_type_nn_bias_16x4_ver_layer1[((ulong)uVar19 & 0xff) * 2 + 3];
          }
          else {
            fVar68 = 0.0;
            local_788._0_4_ = (undefined4)uVar34;
            if (local_788._0_4_ == 5) {
              fVar68 = av1_tx_type_nn_bias_16x4_ver_layer1[((ulong)uVar19 & 0xff) * 2 + 2];
            }
          }
          fVar68 = prune_2D_adaptive_thresholds[uVar55][(int)fVar68];
          local_678 = 0xff000000ff;
          uStack_670 = 0xff000000ff;
          local_688 = 0xff000000ff;
          uStack_680 = 0xff000000ff;
          local_698 = 0xff000000ff;
          uStack_690 = 0xff000000ff;
          dist = 0xff000000ff;
          uStack_6a0 = 0xff000000ff;
          txfm_param_2.tx_set_type = '\0';
          txfm_param_2._17_3_ = 0xbf8000;
          txfm_param_2.eob = -0x40800000;
          txfm_param_2.tx_type = '\0';
          txfm_param_2.tx_size = '\0';
          txfm_param_2._2_2_ = 0xbf80;
          txfm_param_2.lossless = -0x40800000;
          txfm_param_2.bd = -0x40800000;
          txfm_param_2.is_hbd = -0x40800000;
          fVar69 = 0.0;
          uVar56 = 0;
          puVar40 = &prune_tx_2D_tx_type_table_2D;
          uVar67 = 0;
          fVar82 = 0.0;
          uVar34 = 0;
          local_7a0 = 0;
          do {
            uVar41 = *puVar40;
            uVar18 = 1 << ((byte)uVar41 & 0x1f);
            pQVar47 = (QUANT_PARAM *)(ulong)uVar18;
            if ((uVar26 >> (uVar41 & 0x1f) & 1) != 0) {
              fVar88 = (float)(&quant_param.log_scale)[uVar56];
              if (fVar82 < fVar88) {
                uVar34 = uVar56 & 0xffffffff;
                fVar82 = fVar88;
              }
              if (fVar68 <= fVar88) {
                local_7a0 = local_7a0 | uVar18;
                fVar69 = fVar69 + fVar88;
                *(float *)(&txfm_param_2.tx_type + (long)(int)uVar67 * 4) = fVar88;
                *(uint *)((long)&dist + (long)(int)uVar67 * 4) = uVar41;
                uVar67 = uVar67 + 1;
              }
            }
            uVar56 = uVar56 + 1;
            puVar40 = puVar40 + 1;
          } while (uVar56 != 0x10);
          piVar29 = (int64_t *)&prune_tx_2D_tx_type_table_2D;
          if (((local_7a0 & 0xffff) >> ((&prune_tx_2D_tx_type_table_2D)[(int)uVar34] & 0x1f) & 1) ==
              0) {
            local_7a0 = local_7a0 | 1 << ((byte)(&prune_tx_2D_tx_type_table_2D)[(int)uVar34] & 0x1f)
            ;
            uVar11 = local_788._8_8_;
          }
          else {
            fVar68 = (float)txfm_param_2._0_4_;
            if ((float)txfm_param_2.lossless <= (float)txfm_param_2._0_4_) {
              fVar68 = (float)txfm_param_2.lossless;
            }
            uVar26 = dist._4_4_;
            if ((float)txfm_param_2.lossless > (float)txfm_param_2._0_4_) {
              uVar26 = (uint)dist;
              dist._0_4_ = dist._4_4_;
            }
            fVar82 = (float)txfm_param_2.bd;
            if ((float)txfm_param_2.is_hbd <= (float)txfm_param_2.bd) {
              fVar82 = (float)txfm_param_2.is_hbd;
            }
            uVar41 = uStack_6a0._4_4_;
            if ((float)txfm_param_2.is_hbd > (float)txfm_param_2.bd) {
              uVar41 = (uint)uStack_6a0;
              uStack_6a0._0_4_ = uStack_6a0._4_4_;
            }
            fVar88 = (float)txfm_param_2._16_4_;
            if ((float)txfm_param_2.eob <= (float)txfm_param_2._16_4_) {
              fVar88 = (float)txfm_param_2.eob;
            }
            uVar18 = local_698._4_4_;
            if ((float)txfm_param_2.eob > (float)txfm_param_2._16_4_) {
              uVar18 = (uint)local_698;
              local_698._0_4_ = local_698._4_4_;
            }
            fVar84 = (float)(~-(uint)((float)txfm_param_2._0_4_ < (float)txfm_param_2.lossless) &
                             txfm_param_2._0_4_ |
                            txfm_param_2.lossless &
                            -(uint)((float)txfm_param_2._0_4_ < (float)txfm_param_2.lossless));
            fVar73 = (float)(~-(uint)((float)txfm_param_2.bd < (float)txfm_param_2.is_hbd) &
                             txfm_param_2.bd |
                            txfm_param_2.is_hbd &
                            -(uint)((float)txfm_param_2.bd < (float)txfm_param_2.is_hbd));
            fVar91 = (float)(~-(uint)((float)txfm_param_2._16_4_ < (float)txfm_param_2.eob) &
                             txfm_param_2._16_4_ |
                            txfm_param_2.eob &
                            -(uint)((float)txfm_param_2._16_4_ < (float)txfm_param_2.eob));
            fVar100 = -1.0;
            if ((int)uVar67 < 9) {
              uVar57 = (uint)uStack_6a0;
              fVar101 = fVar73;
              if (fVar84 < fVar73) {
                uVar57 = (uint)dist;
                fVar101 = fVar84;
                dist._0_4_ = (uint)uStack_6a0;
              }
              fVar87 = fVar68;
              if (fVar82 <= fVar68) {
                fVar87 = fVar82;
              }
              uVar52 = uVar41;
              if (fVar82 > fVar68) {
                uVar52 = uVar26;
                uVar26 = uVar41;
              }
              fVar96 = fVar91;
              if (-1.0 <= fVar91) {
                fVar96 = fVar100;
              }
              fVar68 = (float)(~-(uint)(fVar68 < fVar82) & (uint)fVar68 |
                              (uint)fVar82 & -(uint)(fVar68 < fVar82));
              uVar41 = (uint)uStack_690;
              if (-1.0 > fVar91) {
                uVar41 = (uint)local_698;
                local_698._0_4_ = (uint)uStack_690;
              }
              fVar100 = (float)(~-(uint)(fVar88 < -1.0) & (uint)fVar88 |
                               -(uint)(fVar88 < -1.0) & 0xbf800000);
              fVar82 = fVar88;
              if (-1.0 <= fVar88) {
                fVar82 = -1.0;
              }
              fVar73 = (float)(~-(uint)(fVar84 < fVar73) & (uint)fVar84 |
                              -(uint)(fVar84 < fVar73) & (uint)fVar73);
              uVar42 = uStack_690._4_4_;
              if (-1.0 > fVar88) {
                uVar42 = uVar18;
                uVar18 = uStack_690._4_4_;
              }
              txfm_param_2._16_4_ =
                   ~-(uint)(fVar91 < -1.0) & (uint)fVar91 | -(uint)(fVar91 < -1.0) & 0xbf800000;
              fVar88 = fVar68;
              if (fVar101 <= fVar68) {
                fVar88 = fVar101;
              }
              uVar58 = uVar57;
              if (fVar101 > fVar68) {
                uVar58 = uVar26;
                uVar26 = uVar57;
              }
              fVar91 = fVar100;
              if (fVar96 <= fVar100) {
                fVar91 = fVar96;
              }
              fVar68 = (float)(~-(uint)(fVar68 < fVar101) & (uint)fVar68 |
                              (uint)fVar101 & -(uint)(fVar68 < fVar101));
              txfm_param_2.eob =
                   ~-(uint)(fVar100 < fVar96) & (uint)fVar100 |
                   -(uint)(fVar100 < fVar96) & (uint)fVar96;
              uVar57 = uVar41;
              if (fVar96 > fVar100) {
                uVar57 = uVar18;
                uVar18 = uVar41;
              }
              uVar95 = ~-(uint)(fVar73 < (float)txfm_param_2._16_4_) & (uint)fVar73 |
                       -(uint)(fVar73 < (float)txfm_param_2._16_4_) & txfm_param_2._16_4_;
              uVar41 = (uint)local_698;
              if (fVar73 < (float)txfm_param_2._16_4_) {
                uVar41 = (uint)dist;
                txfm_param_2._16_4_ = fVar73;
                dist._0_4_ = (uint)local_698;
              }
              uVar97 = uVar42;
              if (fVar87 < fVar82) {
                uVar97 = uVar52;
                uVar52 = uVar42;
              }
              fVar100 = (float)(~-(uint)(fVar68 < (float)txfm_param_2.eob) & (uint)fVar68 |
                               -(uint)(fVar68 < (float)txfm_param_2.eob) & txfm_param_2.eob);
              uVar42 = uVar18;
              if (fVar68 < (float)txfm_param_2.eob) {
                uVar42 = uVar26;
                txfm_param_2.eob = (int)fVar68;
                uVar26 = uVar18;
              }
              fVar82 = (float)(~-(uint)(fVar87 < fVar82) & (uint)fVar87 |
                              (uint)fVar82 & -(uint)(fVar87 < fVar82));
              fVar68 = fVar88;
              if (fVar91 <= fVar88) {
                fVar68 = fVar91;
              }
              fVar73 = (float)(~-(uint)(fVar88 < fVar91) & (uint)fVar88 |
                              -(uint)(fVar88 < fVar91) & (uint)fVar91);
              uVar18 = uVar57;
              if (fVar91 > fVar88) {
                uVar18 = uVar58;
                uVar58 = uVar57;
              }
              bVar66 = fVar100 < (float)txfm_param_2._16_4_;
              uVar92 = -(uint)bVar66 & txfm_param_2._16_4_;
              uVar57 = uVar41;
              if (fVar100 < (float)txfm_param_2._16_4_) {
                uVar57 = uVar26;
                txfm_param_2._16_4_ = fVar100;
                uVar26 = uVar41;
              }
              txfm_param_2.lossless = uVar92 | ~-(uint)bVar66 & (uint)fVar100;
              txfm_param_2.tx_type = (char)uVar95;
              txfm_param_2.tx_size = (char)(uVar95 >> 8);
              txfm_param_2._2_2_ = (short)(uVar95 >> 0x10);
              dist = CONCAT44(uVar26,(uint)dist);
              fVar88 = (float)(~-(uint)(fVar82 < fVar68) & (uint)fVar82 |
                              -(uint)(fVar82 < fVar68) & (uint)fVar68);
              uVar41 = uVar18;
              uVar26 = uVar52;
              if (fVar82 < fVar68) {
                uVar41 = uVar52;
                uVar26 = uVar18;
              }
              uStack_690 = CONCAT44(uVar97,uVar41);
              bVar66 = fVar73 < (float)txfm_param_2._16_4_;
              uVar18 = -(uint)bVar66 & txfm_param_2._16_4_;
              uVar41 = uVar57;
              if (fVar73 < (float)txfm_param_2._16_4_) {
                uVar41 = uVar58;
                txfm_param_2._16_4_ = fVar73;
                uVar58 = uVar57;
              }
              fVar68 = (float)(-(uint)(fVar88 < (float)txfm_param_2.eob) & txfm_param_2.eob |
                              ~-(uint)(fVar88 < (float)txfm_param_2.eob) & (uint)fVar88);
              uVar57 = uVar42;
              if (fVar88 < (float)txfm_param_2.eob) {
                uVar57 = uVar26;
                txfm_param_2.eob = (int)fVar88;
                uVar26 = uVar42;
              }
              bVar65 = fVar68 < (float)txfm_param_2._16_4_;
              uVar95 = -(uint)bVar65 & txfm_param_2._16_4_;
              uVar42 = uVar41;
              if (fVar68 < (float)txfm_param_2._16_4_) {
                uVar42 = uVar26;
                txfm_param_2._16_4_ = fVar68;
                uVar26 = uVar41;
              }
              txfm_param_2.is_hbd = ~-(uint)bVar65 & (uint)fVar68 | uVar95;
              txfm_param_2.bd = ~-(uint)bVar66 & (uint)fVar73 | uVar18;
              uStack_6a0 = CONCAT44(uVar26,uVar58);
              local_698 = CONCAT44(uVar57,uVar42);
            }
            else {
              uVar57 = (uint)uStack_6a0;
              fVar101 = fVar73;
              if (fVar84 < fVar73) {
                uVar57 = (uint)dist;
                dist._0_4_ = (uint)uStack_6a0;
                fVar101 = fVar84;
              }
              uVar42 = uVar41;
              fVar87 = fVar82;
              if (fVar68 < fVar82) {
                uVar42 = uVar26;
                uVar26 = uVar41;
                fVar87 = fVar68;
              }
              uVar41 = (uint)uStack_690;
              if (fVar91 < -1.0) {
                uVar41 = (uint)local_698;
                fVar100 = fVar91;
                local_698._0_4_ = (uint)uStack_690;
              }
              uVar58 = uVar18;
              fVar96 = fVar88;
              if (-1.0 <= fVar88) {
                uVar58 = uStack_690._4_4_;
                uStack_690._4_4_ = uVar18;
                fVar96 = -1.0;
              }
              uStack_710 = 0;
              fVar102 = (float)(~-(uint)(fVar68 < fVar82) & (uint)fVar68 |
                               (uint)fVar82 & -(uint)(fVar68 < fVar82));
              local_658 = (int16_t *)0xbf800000;
              uStack_650 = 0;
              local_658 = (int16_t *)0xbf800000;
              uStack_650 = 0;
              local_658 = (int16_t *)0xbf800000;
              uStack_650 = 0;
              local_6b0 = uStack_670._4_4_;
              fVar82 = (float)(~-(uint)(fVar88 < -1.0) & (uint)fVar88 |
                              -(uint)(fVar88 < -1.0) & 0xbf800000);
              fVar68 = fVar102;
              if (fVar101 <= fVar102) {
                fVar68 = fVar101;
              }
              fVar88 = (float)(~-(uint)(fVar84 < fVar73) & (uint)fVar84 |
                              -(uint)(fVar84 < fVar73) & (uint)fVar73);
              uVar18 = uVar57;
              if (fVar101 > fVar102) {
                uVar18 = uVar26;
                uVar26 = uVar57;
              }
              fVar91 = (float)(~-(uint)(fVar91 < -1.0) & (uint)fVar91 |
                              -(uint)(fVar91 < -1.0) & 0xbf800000);
              fVar73 = fVar82;
              if (fVar100 <= fVar82) {
                fVar73 = fVar100;
              }
              local_578 = ZEXT416((uint)fVar73);
              uVar57 = uVar41;
              if (fVar100 > fVar82) {
                uVar57 = uStack_690._4_4_;
                uStack_690._4_4_ = uVar41;
              }
              uVar41 = (uint)local_698;
              fVar84 = fVar91;
              if (fVar88 < fVar91) {
                uVar41 = (uint)dist;
                fVar84 = fVar88;
                dist._0_4_ = (uint)local_698;
              }
              uVar95 = uVar58;
              fVar99 = fVar96;
              if (fVar87 < fVar96) {
                uVar95 = uVar42;
                uVar42 = uVar58;
                fVar99 = fVar87;
              }
              fVar101 = (float)(~-(uint)(fVar102 < fVar101) & (uint)fVar102 |
                               (uint)fVar101 & -(uint)(fVar102 < fVar101));
              fVar82 = (float)(~-(uint)(fVar82 < fVar100) & (uint)fVar82 |
                              (uint)fVar100 & -(uint)(fVar82 < fVar100));
              local_6d8._0_4_ = fVar101;
              if (fVar82 <= fVar101) {
                local_6d8._0_4_ = fVar82;
              }
              uVar58 = uStack_690._4_4_;
              if (fVar82 > fVar101) {
                uVar58 = uVar26;
                uVar26 = uStack_690._4_4_;
              }
              fVar100 = fVar68;
              if (fVar73 <= fVar68) {
                fVar100 = fVar73;
              }
              fVar88 = (float)(~-(uint)(fVar88 < fVar91) & (uint)fVar88 |
                              -(uint)(fVar88 < fVar91) & (uint)fVar91);
              uVar97 = uVar57;
              if (fVar73 > fVar68) {
                uVar97 = uVar18;
                uVar18 = uVar57;
              }
              bVar66 = -1.0 <= fVar88;
              uVar57 = ~-(uint)(fVar88 < -1.0) & (uint)fVar88 | -(uint)(fVar88 < -1.0) & 0xbf800000;
              if (bVar66) {
                fVar88 = -1.0;
              }
              uVar92 = (uint)dist;
              if (!bVar66) {
                uVar92 = (uint)local_688;
              }
              fVar82 = (float)(~-(uint)(fVar101 < fVar82) & (uint)fVar101 |
                              -(uint)(fVar101 < fVar82) & (uint)fVar82);
              if (!bVar66) {
                local_688._0_4_ = (uint)dist;
              }
              uVar52 = uVar95;
              if (fVar99 < -1.0) {
                uVar52 = uStack_670._4_4_;
              }
              fVar91 = (float)(~-(uint)(fVar87 < fVar96) & (uint)fVar87 |
                              (uint)fVar96 & -(uint)(fVar87 < fVar96));
              if (fVar99 < -1.0) {
                uStack_670._4_4_ = uVar95;
              }
              uStack_660 = 0;
              fVar101 = fVar82;
              if (fVar84 <= fVar82) {
                fVar101 = fVar84;
              }
              uStack_660 = 0;
              local_668 = (ulong)(uint)fVar101;
              uVar95 = uVar41;
              if (fVar84 > fVar82) {
                uVar95 = uVar26;
                uVar26 = uVar41;
              }
              fVar87 = fVar91;
              if (fVar100 <= fVar91) {
                fVar87 = fVar100;
              }
              uVar41 = uVar97;
              if (fVar100 > fVar91) {
                uVar41 = uVar42;
                uVar42 = uVar97;
              }
              fVar73 = (float)(~-(uint)(fVar68 < fVar73) & (uint)fVar68 |
                              (uint)fVar73 & -(uint)(fVar68 < fVar73));
              fVar100 = (float)(~-(uint)(fVar91 < fVar100) & (uint)fVar91 |
                               (uint)fVar100 & -(uint)(fVar91 < fVar100));
              fVar68 = fVar73;
              if (fVar101 <= fVar73) {
                fVar68 = fVar101;
              }
              uVar97 = uVar95;
              if (fVar101 > fVar73) {
                uVar97 = uVar18;
                uVar18 = uVar95;
              }
              local_738 = (ulong)(uint)fVar100;
              if ((float)local_6d8._0_4_ <= fVar100) {
                local_6d8._4_4_ = 0;
                local_738 = local_6d8._0_8_;
              }
              uVar95 = uVar58;
              if ((float)local_6d8._0_4_ > fVar100) {
                uVar95 = uVar42;
                uVar42 = uVar58;
              }
              local_718 = 0;
              fVar91 = (float)(~-(uint)(fVar82 < fVar84) & (uint)fVar82 |
                              (uint)fVar84 & -(uint)(fVar82 < fVar84));
              uStack_6bc = 0;
              uStack_6c0 = 0;
              local_6c8 = 0xbf800000;
              fVar82 = fVar91;
              if (-1.0 <= fVar91) {
                fVar82 = -1.0;
              }
              local_708 = ZEXT416((uint)fVar82);
              fVar100 = (float)(~-(uint)(fVar100 < (float)local_6d8._0_4_) & (uint)fVar100 |
                               local_6d8._0_4_ & -(uint)(fVar100 < (float)local_6d8._0_4_));
              uVar58 = local_688._4_4_;
              if (-1.0 > fVar91) {
                uVar58 = uVar26;
                uVar26 = local_688._4_4_;
              }
              bVar66 = -1.0 <= fVar87;
              fVar84 = fVar87;
              if (bVar66) {
                fVar84 = -1.0;
              }
              uVar62 = uVar41;
              if (!bVar66) {
                uVar62 = (uint)uStack_670;
              }
              local_6d8 = ZEXT416(uVar62);
              if (!bVar66) {
                uStack_670._0_4_ = uVar41;
              }
              fVar96 = (float)(~-(uint)(fVar91 < -1.0) & (uint)fVar91 |
                              -(uint)(fVar91 < -1.0) & 0xbf800000);
              fVar91 = fVar100;
              if (fVar68 <= fVar100) {
                fVar91 = fVar68;
              }
              uVar41 = uVar97;
              if (fVar68 > fVar100) {
                uVar41 = uVar42;
                uVar42 = uVar97;
              }
              local_7b8 = -1.0;
              fVar101 = (float)(~-(uint)(fVar73 < fVar101) & (uint)fVar73 |
                               (uint)fVar101 & -(uint)(fVar73 < fVar101));
              fVar73 = fVar96;
              if (fVar88 <= fVar96) {
                fVar73 = fVar88;
              }
              uVar97 = (uint)local_688;
              if (fVar88 > fVar96) {
                uVar97 = uVar26;
                uVar26 = (uint)local_688;
              }
              txfm_param_2.lossless =
                   -(uint)(fVar96 < fVar88) & (uint)fVar88 |
                   ~-(uint)(fVar96 < fVar88) & (uint)fVar96;
              txfm_param_2.tx_type = (char)uVar57;
              txfm_param_2.tx_size = (char)(uVar57 >> 8);
              txfm_param_2._2_2_ = (short)(uVar57 >> 0x10);
              dist = CONCAT44(uVar26,uVar92);
              fVar88 = fVar101;
              if (-1.0 <= fVar101) {
                fVar88 = -1.0;
              }
              fVar96 = (float)(~-(uint)(fVar99 < -1.0) & (uint)fVar99 |
                              -(uint)(fVar99 < -1.0) & 0xbf800000);
              uVar26 = (uint)uStack_680;
              if (-1.0 > fVar101) {
                uVar26 = uVar18;
                uVar18 = (uint)uStack_680;
              }
              local_6f8._0_8_ = local_738;
              if (-1.0 <= (float)local_738) {
                local_6f8._0_8_ = local_6c8;
              }
              local_6f8._8_8_ = 0;
              auVar89 = local_6f8;
              fVar68 = (float)(~-(uint)(fVar100 < fVar68) & (uint)fVar100 |
                              (uint)fVar68 & -(uint)(fVar100 < fVar68));
              uVar57 = local_678._4_4_;
              if (-1.0 > (float)local_738) {
                uVar57 = uVar95;
                uVar95 = local_678._4_4_;
              }
              fVar100 = (float)(~-(uint)(fVar101 < -1.0) & (uint)fVar101 |
                               -(uint)(fVar101 < -1.0) & 0xbf800000);
              uVar92 = (uint)uStack_670;
              if (fVar96 < fVar84) {
                uVar92 = uVar52;
                uVar52 = (uint)uStack_670;
              }
              uStack_670 = CONCAT44(uStack_670._4_4_,uVar92);
              fVar101 = fVar68;
              if (-1.0 <= fVar68) {
                fVar101 = -1.0;
              }
              uVar92 = uStack_680._4_4_;
              if (-1.0 > fVar68) {
                uVar92 = uVar42;
                uVar42 = uStack_680._4_4_;
              }
              bVar66 = fVar73 <= fVar100;
              fVar102 = fVar100;
              if (bVar66) {
                fVar102 = fVar73;
              }
              fVar84 = (float)(~-(uint)(fVar96 < fVar84) & (uint)fVar96 |
                              (uint)fVar84 & -(uint)(fVar96 < fVar84));
              uVar43 = uVar18;
              if (!bVar66) {
                uVar43 = uVar97;
              }
              fVar68 = (float)(~-(uint)(fVar68 < -1.0) & (uint)fVar68 |
                              -(uint)(fVar68 < -1.0) & 0xbf800000);
              if (!bVar66) {
                uVar97 = uVar18;
              }
              fVar96 = fVar91;
              if (-1.0 <= fVar91) {
                fVar96 = local_7b8;
              }
              uVar18 = (uint)local_678;
              if (-1.0 > fVar91) {
                uVar18 = uVar41;
                uVar41 = (uint)local_678;
              }
              fVar99 = (float)(~-(uint)((float)local_738 < -1.0) & (uint)(float)local_738 |
                              -(uint)((float)local_738 < -1.0) & 0xbf800000);
              uVar54 = uVar57;
              if (fVar84 < (float)local_6f8._0_4_) {
                uVar54 = uVar52;
                uVar52 = uVar57;
              }
              fVar85 = (float)(-(uint)(fVar68 < fVar88) & (uint)fVar88 |
                              ~-(uint)(fVar68 < fVar88) & (uint)fVar68);
              fVar74 = fVar68;
              if (fVar88 <= fVar68) {
                fVar74 = fVar88;
              }
              uVar57 = uVar26;
              if (fVar88 > fVar68) {
                uVar57 = uVar42;
                uVar42 = uVar26;
              }
              fVar68 = fVar99;
              if (fVar96 <= fVar99) {
                fVar68 = fVar96;
              }
              fVar88 = (float)(~-(uint)(fVar87 < -1.0) & (uint)fVar87 |
                              -(uint)(fVar87 < -1.0) & 0xbf800000);
              uVar26 = uVar18;
              if (fVar96 > fVar99) {
                uVar26 = uVar95;
                uVar95 = uVar18;
              }
              fVar98 = (float)(-(uint)(fVar85 < fVar82) & (uint)fVar82 |
                              ~-(uint)(fVar85 < fVar82) & (uint)fVar85);
              fVar87 = fVar85;
              if (fVar82 <= fVar85) {
                fVar87 = fVar82;
              }
              uVar18 = uVar58;
              if (fVar82 > fVar85) {
                uVar18 = uVar42;
                uVar42 = uVar58;
              }
              fVar82 = fVar88;
              if (fVar68 <= fVar88) {
                fVar82 = fVar68;
              }
              fVar84 = (float)(~-(uint)(fVar84 < (float)local_6f8._0_4_) & (uint)fVar84 |
                              local_6f8._0_4_ & -(uint)(fVar84 < (float)local_6f8._0_4_));
              uVar58 = uVar26;
              if (fVar68 > fVar88) {
                uVar58 = uVar62;
                uVar62 = uVar26;
              }
              fVar85 = fVar98;
              if (fVar102 <= fVar98) {
                fVar85 = fVar102;
              }
              fVar96 = (float)(~-(uint)(fVar99 < fVar96) & (uint)fVar99 |
                              (uint)fVar96 & -(uint)(fVar99 < fVar96));
              uVar26 = uVar97;
              if (fVar102 > fVar98) {
                uVar26 = uVar42;
                uVar42 = uVar97;
              }
              txfm_param_2.is_hbd =
                   -(uint)(fVar98 < fVar102) & (uint)fVar102 |
                   ~-(uint)(fVar98 < fVar102) & (uint)fVar98;
              txfm_param_2.bd =
                   ~-(uint)(fVar100 < fVar73) & (uint)fVar100 |
                   -(uint)(fVar100 < fVar73) & (uint)fVar73;
              uStack_6a0 = CONCAT44(uVar42,uVar43);
              fVar68 = (float)(~-(uint)(fVar88 < fVar68) & (uint)fVar88 |
                              (uint)fVar68 & -(uint)(fVar88 < fVar68));
              uVar42 = uVar58;
              if (fVar84 < fVar82) {
                uVar42 = uVar52;
                uVar52 = uVar58;
              }
              fVar100 = (float)(~-(uint)(fVar91 < -1.0) & (uint)fVar91 |
                               -(uint)(fVar91 < -1.0) & 0xbf800000);
              local_678 = CONCAT44(uVar54,uVar42);
              fVar88 = fVar96;
              if (fVar87 <= fVar96) {
                fVar88 = fVar87;
              }
              uVar42 = uVar18;
              if (fVar87 > fVar96) {
                uVar42 = uVar95;
                uVar95 = uVar18;
              }
              fVar91 = (float)(~-(uint)(fVar84 < fVar82) & (uint)fVar84 |
                              (uint)fVar82 & -(uint)(fVar84 < fVar82));
              fVar82 = fVar68;
              if (fVar74 <= fVar68) {
                fVar82 = fVar74;
              }
              fVar73 = (float)(~-(uint)(fVar96 < fVar87) & (uint)fVar96 |
                              (uint)fVar87 & -(uint)(fVar96 < fVar87));
              uVar18 = uVar57;
              if (fVar74 > fVar68) {
                uVar18 = uVar62;
                uVar62 = uVar57;
              }
              fVar84 = fVar100;
              if (fVar85 <= fVar100) {
                fVar84 = fVar85;
              }
              uVar57 = uVar26;
              if (fVar85 > fVar100) {
                uVar57 = uVar41;
                uVar41 = uVar26;
              }
              fVar87 = (float)(-(uint)(fVar91 < fVar101) & (uint)fVar101 |
                              ~-(uint)(fVar91 < fVar101) & (uint)fVar91);
              fVar68 = (float)(~-(uint)(fVar68 < fVar74) & (uint)fVar68 |
                              (uint)fVar74 & -(uint)(fVar68 < fVar74));
              uVar26 = uVar92;
              if (fVar91 < fVar101) {
                uVar26 = uVar52;
                uVar52 = uVar92;
              }
              bVar66 = fVar73 < fVar84;
              uVar97 = -(uint)bVar66 & (uint)fVar84;
              uVar58 = uVar57;
              if (fVar73 < fVar84) {
                uVar58 = uVar95;
                fVar84 = fVar73;
                uVar95 = uVar57;
              }
              txfm_param_2.eob = ~-(uint)bVar66 & (uint)fVar73 | uVar97;
              txfm_param_2._16_4_ =
                   ~-(uint)(fVar100 < fVar85) & (uint)fVar100 |
                   -(uint)(fVar100 < fVar85) & (uint)fVar85;
              local_698 = CONCAT44(uVar95,uVar41);
              fVar100 = (float)(-(uint)(fVar87 < fVar82) & (uint)fVar82 |
                               ~-(uint)(fVar87 < fVar82) & (uint)fVar87);
              uVar57 = uVar18;
              uVar41 = uVar52;
              if (fVar87 < fVar82) {
                uVar57 = uVar52;
                uVar41 = uVar18;
              }
              uStack_680 = CONCAT44(uVar26,uVar57);
              uVar60 = local_6b8 & 0xffffffff;
              uVar26 = uVar58;
              if (fVar68 < fVar84) {
                uVar26 = uVar62;
                fVar84 = fVar68;
                uVar62 = uVar58;
              }
              uVar18 = uVar42;
              if (fVar100 < fVar88) {
                uVar18 = uVar41;
                uVar41 = uVar42;
              }
              uVar57 = uVar26;
              if ((float)(-(uint)(fVar100 < fVar88) & (uint)fVar88 |
                         ~-(uint)(fVar100 < fVar88) & (uint)fVar100) < fVar84) {
                uVar57 = uVar41;
                uVar41 = uVar26;
              }
              uStack_690 = CONCAT44(uVar41,uVar62);
              local_688 = CONCAT44(uVar18,uVar57);
              local_6f8 = auVar89;
            }
            local_788._8_8_ = 0;
            uVar11 = local_788._8_8_;
            local_788._8_8_ = 0;
            pQVar47 = (QUANT_PARAM *)(ulong)uVar52;
            piVar29 = &dist;
            if ((uVar19 & 0xfc) != 0) {
              if ((int)uVar67 < 1) {
                uVar34 = 0;
LAB_0024c39f:
                if ((int)uVar34 < (int)uVar67) {
                  uVar34 = uVar34 & 0xffffffff;
                  do {
                    local_7a0 = local_7a0 & ~(1 << (*(byte *)((long)&dist + uVar34 * 4) & 0x1f));
                    uVar34 = uVar34 + 1;
                    uVar11 = local_788._8_8_;
                  } while (uVar67 != (uint)uVar34);
                }
              }
              else {
                fVar82 = 0.0;
                uVar34 = 0;
                fVar68 = 0.0;
                do {
                  bVar66 = 1 < (uint)uVar34;
                  pQVar47 = (QUANT_PARAM *)CONCAT71((int7)((ulong)pQVar47 >> 8),bVar66);
                  if (30.0 < fVar82 && bVar66) goto LAB_0024c39f;
                  fVar68 = fVar68 + *(float *)(&txfm_param_2.tx_type + uVar34 * 4);
                  fVar82 = (100.0 / fVar69) * fVar68;
                  uVar34 = uVar34 + 1;
                } while (uVar67 != uVar34);
              }
            }
          }
          local_788._8_8_ = uVar11;
          bVar25 = (byte)uVar60;
          txk_map._0_8_ = *piVar29;
          txk_map._8_8_ = piVar29[1];
          txk_map._16_8_ = piVar29[2];
          txk_map._24_8_ = piVar29[3];
          txk_map._32_8_ = piVar29[4];
          txk_map._40_8_ = piVar29[5];
          txk_map._48_8_ = piVar29[6];
          txk_map._56_8_ = piVar29[7];
        }
        else {
          iVar17 = (x->txfm_search_params).prune_2d_txfm_mode;
          iVar15 = prune_factors[iVar17];
          if (7 < uVar67) {
            iVar17 = mul_factors[iVar17];
            idx_v[0] = 0;
            idx_v[1] = 1;
            idx_v[2] = 2;
            idx_v[3] = 3;
            idx_h[0] = 0;
            idx_h[1] = 1;
            idx_h[2] = 2;
            idx_h[3] = 3;
            skip_v[0] = 0;
            skip_v[1] = 0;
            skip_v[2] = 0;
            skip_v[3] = 0;
            skip_h[0] = 0;
            skip_h[1] = 0;
            skip_h[2] = 0;
            skip_h[3] = 0;
            lVar44 = 0;
            av1_setup_xform(cm,x,tx_size,'\0',&txfm_param_2);
            av1_setup_quant(tx_size,1,1,(cpi->oxcf).q_cfg.quant_b_adapt,(QUANT_PARAM *)ctxl);
            txfm_param_2.tx_set_type = '\x05';
            dist_1 = 0;
            pCVar1 = &(cpi->common).quant_params;
            do {
              TVar32 = *(TX_TYPE *)((long)&prune_tx_2D_tx_type_table_2D + lVar44);
              txfm_param_2.tx_type = TVar32;
              av1_setup_qmatrix(pCVar1,xd,plane,tx_size,TVar32,(QUANT_PARAM *)ctxl);
              av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param_2,
                              (QUANT_PARAM *)ctxl);
              dist_block_tx_domain
                        (x,plane,block,tx_size,(qm_val_t *)CONCAT44(ctxl._12_4_,ctxl._8_4_),
                         av1_scan_orders[(ulong)txfm_param_2._0_8_ >> 8 & 0xff]
                         [txfm_param_2._0_8_ & 0xff].scan,&dist_1,&local_440);
              pQVar47 = (QUANT_PARAM *)0x0;
              iVar16 = av1_cost_coeffs_txb_laplacian
                                 (x,plane,block,tx_size,TVar32,txb_ctx,(uint)bVar65,0);
              lVar38 = dist_1 * 0x80 + ((long)x->rdmult * (long)iVar16 + 0x100 >> 9);
              *(long *)((long)&dist + lVar44 * 2) = lVar38;
              if (ref_best_rd < lVar38 - (lVar38 >> 2)) {
                *(undefined4 *)((long)skip_h + lVar44) = 1;
              }
              lVar44 = lVar44 + 4;
            } while (lVar44 != 0x10);
            lVar44 = 1;
            bVar25 = (byte)local_6b8;
            do {
              lVar38 = (&dist)[lVar44];
              lVar27 = 0;
LAB_0024a169:
              if ((&dist)[lVar27] <= lVar38) goto code_r0x0024a173;
              iVar16 = idx_h[lVar44];
              pQVar47 = (QUANT_PARAM *)lVar44;
              do {
                (&dist)[(long)pQVar47] = *(int64_t *)(&local_6b0 + (long)pQVar47 * 2);
                idx_h[(long)pQVar47] = idx_h[(long)pQVar47 + -1];
                pQVar47 = (QUANT_PARAM *)((long)pQVar47 + -1);
              } while (lVar27 < (long)pQVar47);
              (&dist)[lVar27] = lVar38;
              idx_h[lVar27] = iVar16;
LAB_0024a1c2:
              lVar44 = lVar44 + 1;
            } while ((undefined1 *)lVar44 != &DAT_00000004);
            lVar44 = 1;
            do {
              if ((double)dist * 1.2 < (double)(&dist)[lVar44]) {
                skip_h[idx_h[lVar44]] = 1;
              }
              lVar44 = lVar44 + 1;
            } while (lVar44 != 4);
            lVar44 = (long)idx_h[0];
            if (skip_h[lVar44] == 0) {
              uVar67 = (int)(uVar67 * iVar17 + 0x32) / 100;
              txfm_param.tx_type = (undefined1)dist;
              txfm_param.tx_size = dist._1_1_;
              txfm_param._2_2_ = dist._2_2_;
              txfm_param.lossless = dist._4_4_;
              lVar38 = 1;
              do {
                TVar32 = *(TX_TYPE *)
                          (&prune_tx_2D_tx_type_table_2D + lVar44 + (long)idx_v[lVar38] * 4);
                txfm_param_2.tx_type = TVar32;
                av1_setup_qmatrix(pCVar1,xd,plane,tx_size,TVar32,(QUANT_PARAM *)ctxl);
                av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param_2,
                                (QUANT_PARAM *)ctxl);
                dist_block_tx_domain
                          (x,plane,block,tx_size,(qm_val_t *)CONCAT44(ctxl._12_4_,ctxl._8_4_),
                           av1_scan_orders[(ulong)txfm_param_2._0_8_ >> 8 & 0xff]
                           [txfm_param_2._0_8_ & 0xff].scan,&dist_1,&local_440);
                iVar17 = av1_cost_coeffs_txb_laplacian
                                   (x,plane,block,tx_size,TVar32,txb_ctx,(uint)bVar65,0);
                lVar27 = dist_1 * 0x80 + ((long)x->rdmult * (long)iVar17 + 0x100 >> 9);
                *(long *)(&txfm_param.tx_type + lVar38 * 8) = lVar27;
                if (ref_best_rd < lVar27 - (lVar27 >> 2)) {
                  skip_v[lVar38] = 1;
                }
                lVar38 = lVar38 + 1;
              } while (lVar38 != 4);
              lVar44 = 1;
              do {
                lVar38 = *(long *)(&txfm_param.tx_type + lVar44 * 8);
                lVar27 = 0;
                while (*(long *)(&txfm_param.tx_type + lVar27 * 8) <= lVar38) {
                  lVar27 = lVar27 + 1;
                  if (lVar44 == lVar27) goto LAB_0024a455;
                }
                iVar17 = idx_v[lVar44];
                lVar35 = lVar44;
                do {
                  *(undefined8 *)(&txfm_param.tx_type + lVar35 * 8) =
                       *(undefined8 *)(idx_v + lVar35 * 2 + 2);
                  idx_v[lVar35] = idx_h[lVar35 + 3];
                  lVar35 = lVar35 + -1;
                } while (lVar27 < lVar35);
                *(long *)(&txfm_param.tx_type + lVar27 * 8) = lVar38;
                idx_v[lVar27] = iVar17;
LAB_0024a455:
                lVar44 = lVar44 + 1;
              } while (lVar44 != 4);
              lVar44 = 1;
              do {
                if ((double)(long)txfm_param._0_8_ * 1.2 <
                    (double)*(long *)(&txfm_param.tx_type + lVar44 * 8)) {
                  skip_v[idx_v[lVar44]] = 1;
                }
                lVar44 = lVar44 + 1;
              } while (lVar44 != 4);
              lVar44 = 0;
              iVar17 = 0xf;
              pQVar47 = (QUANT_PARAM *)&DAT_00511420;
              uVar19 = 0;
              bVar25 = (byte)local_6b8;
              do {
                iVar16 = *(int *)((long)&DAT_005113e0 + lVar44);
                iVar71 = *(int *)((long)&DAT_00511420 + lVar44);
                uVar41 = (&prune_tx_2D_tx_type_table_2D)
                         [(long)idx_h[iVar71] + (long)idx_v[iVar16] * 4];
                if (((((uint)(int)(short)uVar26 >> (uVar41 & 0x1f) & 1) == 0) ||
                    (skip_h[idx_h[iVar71]] != 0)) || (skip_v[idx_v[iVar16]] != 0)) {
                  txk_map[iVar17] = uVar41;
                  iVar17 = iVar17 + -1;
                }
                else {
                  txk_map[(int)uVar19] = uVar41;
                  *(ulong *)(&quant_param.log_scale + (long)(int)uVar19 * 2) =
                       (&dist)[iVar71] + *(long *)(&txfm_param.tx_type + (long)iVar16 * 8) +
                       (ulong)((&dist)[iVar71] + *(long *)(&txfm_param.tx_type + (long)iVar16 * 8)
                              == 0);
                  uVar19 = uVar19 + 1;
                }
                lVar44 = lVar44 + 4;
              } while (lVar44 != 0x40);
              if (1 < (int)uVar19) {
                uVar34 = 1;
                do {
                  lVar44 = *(long *)(&quant_param.log_scale + uVar34 * 2);
                  uVar60 = 0;
LAB_0024a59a:
                  if (*(long *)(&quant_param.log_scale + uVar60 * 2) <= lVar44)
                  goto code_r0x0024a5a4;
                  uVar41 = txk_map[uVar34];
                  pQVar47 = (QUANT_PARAM *)(ulong)uVar41;
                  uVar56 = uVar34;
                  do {
                    *(int64_t *)(&quant_param.log_scale + uVar56 * 2) = (&local_440)[uVar56];
                    txk_map[uVar56] = txk_map[uVar56 - 1];
                    uVar56 = uVar56 - 1;
                  } while ((long)uVar60 < (long)uVar56);
                  *(long *)(&quant_param.log_scale + uVar60 * 2) = lVar44;
                  txk_map[uVar60] = uVar41;
LAB_0024a5f5:
                  uVar34 = uVar34 + 1;
                  if (uVar34 == uVar19) break;
                } while( true );
              }
              local_7a0 = 1 << ((byte)txk_map[0] & 0x1f);
              if ((int)uVar19 < (int)uVar67) {
                uVar67 = uVar19;
              }
              if ((int)uVar67 < 2) goto LAB_0024a65d;
              local_7a0 = ~local_7a0;
              pQVar47 = (QUANT_PARAM *)0x1;
              do {
                if ((long)iVar15 <=
                    ((*(long *)(&quant_param.log_scale + (long)pQVar47 * 2) -
                     CONCAT44(quant_param._4_4_,quant_param.log_scale)) * 0x708) /
                    CONCAT44(quant_param._4_4_,quant_param.log_scale)) break;
                local_7a0 = local_7a0 & ~(1 << (*(byte *)(txk_map + (long)pQVar47) & 0x1f));
                pQVar47 = (QUANT_PARAM *)((long)&pQVar47->log_scale + 1);
              } while ((QUANT_PARAM *)(ulong)uVar67 != pQVar47);
              local_7a0 = ~local_7a0;
            }
            else {
              local_7a0 = 0;
            }
LAB_0024a65d:
            local_788._8_8_ = local_788._0_8_;
            local_7a0 = local_7a0 & uVar26;
            goto LAB_00248b03;
          }
          uVar67 = 0;
          av1_setup_xform(cm,x,tx_size,'\0',&txfm_param);
          pQVar47 = (QUANT_PARAM *)ctxl;
          av1_setup_quant(tx_size,1,1,(cpi->oxcf).q_cfg.quant_b_adapt,pQVar47);
          local_788._8_8_ = local_788._0_8_;
          uStack_770 = local_778;
          local_778 = 0xf;
          uVar34 = 0;
          do {
            auVar89 = _local_778;
            dist = 0;
            if ((uVar26 >> (uVar67 & 0x1f) & 1) == 0) {
              iVar17 = (int)local_778;
              txk_map[iVar17] = uVar67;
              local_778._4_4_ = 0;
              local_778._0_4_ = iVar17 - 1;
              uStack_770 = auVar89._8_8_;
            }
            else {
              TVar32 = (TX_TYPE)uVar67;
              txfm_param.tx_type = TVar32;
              av1_setup_qmatrix(&(cpi->common).quant_params,xd,plane,tx_size,TVar32,
                                (QUANT_PARAM *)ctxl);
              av1_xform_quant(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param,
                              (QUANT_PARAM *)ctxl);
              iVar17 = av1_cost_coeffs_txb_laplacian
                                 (x,plane,block,tx_size,TVar32,txb_ctx,(uint)bVar65,0);
              pQVar47 = (QUANT_PARAM *)CONCAT44(ctxl._12_4_,ctxl._8_4_);
              dist_block_tx_domain
                        (x,plane,block,tx_size,(qm_val_t *)pQVar47,
                         av1_scan_orders[(ulong)txfm_param._0_8_ >> 8 & 0xff]
                         [txfm_param._0_8_ & 0xff].scan,&dist,(int64_t *)&txfm_param_2);
              iVar16 = (int)uVar34;
              txk_map[iVar16] = uVar67;
              uVar60 = local_6b8 & 0xffffffff;
              lVar44 = (long)x->rdmult * (long)iVar17 + 0x100 >> 9;
              *(ulong *)(&quant_param.log_scale + (long)iVar16 * 2) =
                   dist * 0x80 + lVar44 + (ulong)(lVar44 + dist * 0x80 == 0);
              uVar34 = (ulong)(iVar16 + 1);
            }
            bVar25 = (byte)uVar60;
            uVar67 = uVar67 + 1;
          } while (uVar67 != 0x10);
          if ((int)uVar34 == 0) {
            local_7a0 = 0;
          }
          else {
            if (1 < (int)uVar34) {
              uVar60 = 1;
              do {
                lVar44 = *(long *)(&quant_param.log_scale + uVar60 * 2);
                uVar56 = 0;
LAB_00249bae:
                if (*(long *)(&quant_param.log_scale + uVar56 * 2) <= lVar44) goto code_r0x00249bb8;
                iVar17 = txk_map[uVar60];
                uVar51 = uVar60;
                do {
                  *(int64_t *)(&quant_param.log_scale + uVar51 * 2) = (&local_440)[uVar51];
                  txk_map[uVar51] = txk_map[uVar51 - 1];
                  uVar51 = uVar51 - 1;
                } while ((long)uVar56 < (long)uVar51);
                *(long *)(&quant_param.log_scale + uVar56 * 2) = lVar44;
                txk_map[uVar56] = iVar17;
LAB_00249c07:
                uVar60 = uVar60 + 1;
              } while (uVar60 != uVar34);
              local_7a0 = -2 << ((byte)txk_map[0] & 0x1f) |
                          0xfffffffeU >> 0x20 - ((byte)txk_map[0] & 0x1f);
              uVar60 = 1;
              pQVar47 = (QUANT_PARAM *)CONCAT44(quant_param._4_4_,quant_param.log_scale);
              do {
                if ((long)iVar15 <=
                    ((*(long *)(&quant_param.log_scale + uVar60 * 2) - (long)pQVar47) * 1000) /
                    (long)pQVar47) break;
                local_7a0 = local_7a0 & ~(1 << (*(byte *)(txk_map + uVar60) & 0x1f));
                uVar60 = uVar60 + 1;
              } while (uVar34 != uVar60);
              local_7a0 = ~local_7a0;
              goto LAB_0024a67a;
            }
            local_7a0 = 1 << ((byte)txk_map[0] & 0x1f);
          }
LAB_0024a67a:
          local_7a0 = local_7a0 & uVar26;
        }
      }
      else {
LAB_00248adb:
        uVar26 = uVar67 & 0xf;
        if ((cpi->oxcf).txfm_cfg.enable_flip_idtx != false) {
          uVar26 = uVar67;
        }
        uVar60 = 0;
LAB_00248af2:
        local_7a0 = uVar26 & 1 << ((byte)uVar60 & 0x1f);
LAB_00248afe:
        bVar25 = (byte)uVar60;
      }
LAB_00248b03:
      if ((short)local_7a0 == 0) {
        bVar25 = (byte)local_600;
        local_7a0 = 1 << ((byte)local_600 & 0x1f);
      }
      bVar66 = 0xf < bVar25;
      uVar50 = (undefined7)((ulong)pQVar47 >> 8);
    }
  }
  else {
    bVar25 = 3;
    if ((uVar26 & 8) != 0) {
      bVar25 = (char)(x->e_mbd).bd - 5;
    }
    bVar2 = block_size_high[txsize_to_bsize[uVar55]];
    iVar17 = (x->e_mbd).mb_to_bottom_edge;
    uVar26 = (uint)bVar2;
    if (iVar17 < 0) {
      bVar9 = (char)(x->e_mbd).plane[plane].subsampling_y + 3U & 0x1f;
      uVar67 = (uint)block_size_high[uVar28] + blk_row * -4 + (iVar17 >> bVar9);
      if ((int)uVar67 < (int)(uint)bVar2) {
        uVar26 = uVar67;
      }
      if ((int)uVar67 < 0) {
        uVar26 = 0 >> bVar9;
      }
    }
    sVar3 = *local_6e8->dequant_QTX;
    uVar67 = (uint)block_size_wide[txsize_to_bsize[uVar55]];
    iVar17 = (x->e_mbd).mb_to_right_edge;
    uVar19 = (uint)block_size_wide[uVar28];
    if (iVar17 < 0) {
      bVar2 = (char)(x->e_mbd).plane[plane].subsampling_x + 3U & 0x1f;
      uVar41 = uVar19 + blk_col * -4 + (iVar17 >> bVar2);
      if ((int)uVar41 < (int)(uint)block_size_wide[txsize_to_bsize[uVar55]]) {
        uVar67 = uVar41;
      }
      if ((int)uVar41 < 0) {
        uVar67 = 0 >> bVar2;
      }
    }
    quant_param.log_scale = 0;
    uVar20 = (*aom_sum_sse_2d_i16)
                       (local_6e8->src_diff + (int)((uVar19 * blk_row + blk_col) * 4),uVar19,uVar67,
                        uVar26,&quant_param.log_scale);
    block_mse_q8 = 0xffffffff;
    t_left = (ENTROPY_CONTEXT *)0xffffffffffffffff;
    if ((int)uVar67 < 1) {
      local_598 = 0x7fffffffffffffff;
    }
    else {
      local_598 = 0x7fffffffffffffff;
      if (0 < (int)uVar26) {
        iVar17 = -quant_param.log_scale;
        if (0 < quant_param.log_scale) {
          iVar17 = quant_param.log_scale;
        }
        dVar70 = 1.0 / (double)(int)(uVar67 * uVar26);
        local_598 = (long)((double)iVar17 * dVar70) * -0x80;
        if (0 < quant_param.log_scale) {
          local_598 = (long)((double)iVar17 * dVar70) * 0x80;
        }
        auVar89._8_4_ = (int)(uVar20 >> 0x18);
        auVar89._0_8_ = uVar20 << 8;
        auVar89._12_4_ = 0x45300000;
        block_mse_q8 = (uint)(long)(((auVar89._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)(uVar20 << 8)) -
                                    4503599627370496.0)) * dVar70);
        dVar70 = dVar70 * (double)quant_param.log_scale * (double)quant_param.log_scale;
        uVar34 = (ulong)dVar70;
        t_left = (ENTROPY_CONTEXT *)
                 (uVar20 - ((long)(dVar70 - 9.223372036854776e+18) & (long)uVar34 >> 0x3f | uVar34))
        ;
      }
    }
    dVar70 = (double)(iVar33 >> (bVar25 & 0x1f));
    dVar70 = dVar70 * 1.8 * dVar70;
    uVar34 = (ulong)dVar70;
    uVar26 = ((x->e_mbd).cur_buf)->flags;
    if ((uVar26 & 8) != 0) {
      bVar25 = (char)(x->e_mbd).bd * '\x02' - 0x10;
      t_left = (ENTROPY_CONTEXT *)
               ((ulong)(t_left + ((uint)(1 << (bVar25 & 0x1f)) >> 1)) >> (bVar25 & 0x3f));
    }
    if ((ENTROPY_CONTEXT *)((long)(dVar70 - 9.223372036854776e+18) & (long)uVar34 >> 0x3f | uVar34)
        <= t_left) {
LAB_00248794:
LAB_00248799:
      pRVar21 = best_rd_stats;
      if (best_rd_stats->skip_txfm == '\x01') {
LAB_002487ab:
        if (plane != 0) {
          return;
        }
        (x->e_mbd).tx_type_map[local_4f8] = '\0';
        return;
      }
      goto LAB_002481aa;
    }
    lVar44 = -local_598;
    if (0 < local_598) {
      lVar44 = local_598;
    }
    if ((long)((ulong)dc_coeff_scale[uVar55] * lVar44) < (long)(((int)sVar3 >> 3) << 0xc)) {
      best_rd_stats->skip_txfm = '\x01';
      local_6e0 = (ulong)block;
      local_6e8->eobs[local_6e0] = 0;
      if ((uVar26 & 8) != 0) {
        bVar25 = (char)(x->e_mbd).bd * '\x02' - 0x10;
        uVar20 = (long)(uVar20 + ((uint)(1 << (bVar25 & 0x1f)) >> 1)) >> (bVar25 & 0x3f);
      }
      best_rd_stats->dist = uVar20 << 4;
      best_rd_stats->sse = uVar20 << 4;
      t_left = ctxl;
      av1_get_entropy_contexts
                (plane_bsize,(macroblockd_plane *)&(x->e_mbd).plane[plane].plane_type,
                 (ENTROPY_CONTEXT *)&quant_param,t_left);
      bVar25 = ""[uVar55];
      bVar2 = ""[uVar55];
      get_txb_ctx(plane_bsize,tx_size,plane,(ENTROPY_CONTEXT *)&quant_param,t_left,
                  (TXB_CTX *)&txfm_param);
      iVar17 = (x->coeff_costs).coeff_costs[(uint)bVar25 + (uint)bVar2 + 1 >> 1 & 0xff][plane != 0].
               txb_skip_cost[(int)txfm_param._0_4_][1];
      best_rd_stats->rate = iVar17;
      best_rd_stats->rdcost =
           best_rd_stats->sse * 0x80 + ((long)x->rdmult * (long)iVar17 + 0x100 >> 9);
      local_6e8->txb_entropy_ctx[local_6e0] = '\0';
      goto LAB_00248794;
    }
    if (((x->txfm_search_params).predict_dc_level < 2) ||
       ((plane != 0 &&
        ((plane < 1 || (((pMVar4->field_0xa7 & 0x80) == 0 && (pMVar4->ref_frame[0] < '\x01'))))))))
    goto LAB_00248799;
    if (best_rd_stats->skip_txfm == '\x01') goto LAB_002487ab;
    local_7a0 = 1;
    uVar50 = (undefined7)((ulong)t_left >> 8);
    bVar66 = true;
    local_6e0 = local_6e0 & 0xffffffff00000000;
  }
  cVar30 = (char)local_5f0;
  if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
    bVar25 = (char)(x->e_mbd).bd * '\x02' - 0x10;
    uVar26 = (uint)(1 << (bVar25 & 0x1f)) >> 1;
    uVar20 = (long)(uVar20 + uVar26) >> (bVar25 & 0x3f);
    block_mse_q8 = uVar26 + block_mse_q8 >> (bVar25 & 0x1f);
  }
  uVar26 = (x->txfm_search_params).use_transform_domain_distortion;
  lVar44 = (long)(iVar33 >> (bVar24 & 0x1f));
  bVar65 = (ulong)block_mse_q8 <=
           lVar44 * lVar44 * (ulong)(x->txfm_search_params).coeff_opt_thresholds[0];
  if (uVar26 == 0) {
    local_718 = (ulong)local_718._4_4_ << 0x20;
    local_748 = 0;
  }
  else if ((block_mse_q8 < (x->txfm_search_params).tx_domain_dist_threshold) ||
          ((0x61810UL >> (uVar55 & 0x3f) & 1) != 0)) {
    local_718 = (ulong)local_718._4_4_ << 0x20;
    local_748 = 0;
  }
  else {
    local_748 = (byte)local_6e0;
    if (local_748 == 1 && uVar26 == 1) {
      if (x->rd_model == '\x01') {
        local_748 = 1;
        local_718 = (ulong)local_718._4_4_ << 0x20;
      }
      else {
        local_748 = bVar66 & (short)local_7a0 != 1;
        local_718 = CONCAT44(local_718._4_4_,(int)CONCAT71(uVar50,local_748));
      }
    }
    else {
      local_718 = (ulong)local_718._4_4_ << 0x20;
    }
  }
  lVar35 = uVar20 * 0x10;
  puVar7 = local_6e8->eobs;
  lVar36 = 0;
  av1_setup_xform(cm,x,tx_size,'\0',&txfm_param);
  av1_setup_quant(tx_size,(uint)((cVar30 == '\0' && skip_trellis == 0) && bVar65),
                  (uint)((cVar30 != '\0' || skip_trellis != 0) || !bVar65),
                  (cpi->oxcf).q_cfg.quant_b_adapt,&quant_param);
  lVar38 = CONCAT44(ctxl._12_4_,ctxl._8_4_);
  local_7a0 = local_7a0 & 0xffff;
  pCVar1 = &(cpi->common).quant_params;
  local_6f8._0_8_ = &x->plane[plane].coeff;
  local_6b8 = (ulong)(block << 4);
  local_708._0_4_ = (int)CONCAT71((int7)(int3)((uint)(block << 4) >> 8),tx_size) + -0x11;
  lVar27 = 0x7fffffffffffffff;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_788._8_8_;
  local_788 = auVar10 << 0x40;
  uVar26 = 0;
  local_6c8 = 0;
  uVar63 = (undefined4)local_6e0;
  do {
    auVar89 = local_788;
    uVar67 = txk_map[lVar36];
    if (((uVar67 & 0xff) != 0xff) && ((local_7a0 >> (uVar67 & 0x1f) & 1) != 0)) {
      TVar32 = (TX_TYPE)uVar67;
      txfm_param.tx_type = TVar32;
      local_5f0 = lVar27;
      ctxl._8_8_ = lVar38;
      _Var12 = av1_use_qmatrix(pCVar1,xd,*(ushort *)&pMVar4->field_0xa7 & 7);
      if (_Var12) {
        av1_setup_qmatrix(pCVar1,xd,plane,tx_size,TVar32,&quant_param);
      }
      if (plane == 0) {
        (x->e_mbd).tx_type_map[local_4f8] = TVar32;
      }
      ctxl[0] = -1;
      ctxl[1] = -1;
      ctxl[2] = -1;
      ctxl[3] = '\x7f';
      ctxl[4] = '\0';
      ctxl[5] = '\0';
      ctxl[6] = '\0';
      ctxl[7] = '\0';
      ctxl[8] = -1;
      ctxl[9] = -1;
      ctxl[10] = -1;
      ctxl[0xb] = -1;
      ctxl[0xc] = -1;
      ctxl[0xd] = -1;
      ctxl[0xe] = -1;
      ctxl[0xf] = '\x7f';
      ctxl[0x10] = -1;
      ctxl[0x11] = -1;
      ctxl[0x12] = -1;
      ctxl[0x13] = -1;
      ctxl[0x14] = -1;
      ctxl[0x15] = -1;
      ctxl[0x16] = -1;
      ctxl[0x17] = '\x7f';
      ctxl[0x18] = -1;
      ctxl[0x19] = -1;
      ctxl[0x1a] = -1;
      ctxl[0x1b] = -1;
      ctxl[0x1c] = -1;
      ctxl[0x1d] = -1;
      ctxl[0x1e] = -1;
      ctxl[0x1f] = '\x7f';
      if ((char)uVar63 == '\0') {
        av1_xform_dc_only(x,plane,block,&txfm_param,local_598);
      }
      else {
        av1_xform(x,plane,block,blk_row,blk_col,plane_bsize,&txfm_param);
      }
      uVar34 = (ulong)(x->txfm_search_params).coeff_opt_thresholds[1];
      if (uVar34 != 0xffffffff && ((cVar30 == '\0' && skip_trellis == 0) && bVar65)) {
        if ((0xc < tx_size) || (iVar33 = 0x400, (0x1810U >> (uVar14 & 0x1f) & 1) == 0)) {
          iVar33 = 0x200;
          if (1 < local_708[0]) {
            iVar33 = tx_size_2d[uVar55];
          }
        }
        iVar17 = (cpi->oxcf).q_cfg.quant_b_adapt;
        ptVar61 = (tran_low_t *)(local_6b8 * 4 + *(long *)local_6f8._0_8_);
        iVar15 = av1_get_tx_scale(tx_size);
        if ((char)local_6e0 == '\0') {
          iVar33 = *ptVar61;
          iVar16 = -iVar33;
          if (0 < iVar33) {
            iVar16 = iVar33;
          }
        }
        else {
          iVar16 = (*aom_satd)(ptVar61,iVar33);
        }
        iVar33 = iVar16 >> (1U - (char)iVar15 & 0x1f);
        if (1 < iVar15) {
          iVar33 = iVar16 << ((char)iVar15 - 1U & 0x1f);
        }
        bVar66 = (long)sqrt_tx_pixels_2d[uVar55] * uVar34 * lVar44 <
                 (ulong)(long)(iVar33 >> ((char)(x->e_mbd).bd - 8U & 0x1f));
        av1_setup_quant(tx_size,(uint)!bVar66,(uint)bVar66,iVar17,&quant_param);
      }
      av1_quant(x,plane,block,&txfm_param,&quant_param);
      if (quant_param.use_optimize_b == 0) {
        rate_cost = av1_cost_coeffs_txb(x,plane,block,tx_size,TVar32,txb_ctx,
                                        (uint)(cpi->common).features.reduced_tx_set_used);
      }
      else {
        av1_optimize_b(cpi,x,plane,block,tx_size,TVar32,txb_ctx,&rate_cost);
      }
      lVar38 = CONCAT44(ctxl._12_4_,ctxl._8_4_);
      uVar63 = (undefined4)local_6e0;
      lVar27 = local_5f0;
      if ((long)x->rdmult * (long)rate_cost + 0x100 >> 9 <= local_5f0) {
        if (puVar7[block] == 0) {
          ctxl._24_8_ = lVar35;
          ctxl._8_4_ = (undefined4)lVar35;
          ctxl._12_4_ = (undefined4)((ulong)lVar35 >> 0x20);
          lVar38 = lVar35;
        }
        else if ((char)local_6e0 == '\0') {
          ctxl._24_8_ = lVar35;
          lVar38 = dist_block_px_domain(cpi,x,plane,plane_bsize,block,blk_row,blk_col,tx_size);
          ctxl._8_4_ = (undefined4)lVar38;
          ctxl._12_4_ = (undefined4)((ulong)lVar38 >> 0x20);
        }
        else if (local_748 == 0) {
          lVar27 = (long)tx_size_2d[uVar55] * 0x4000;
          if ((tx_size == '\x04') || (lVar38 = 0x7fffffffffffffff, lVar27 <= lVar35)) {
            dist_block_tx_domain
                      (x,plane,block,tx_size,
                       (qm_val_t *)CONCAT44(quant_param.qmatrix._4_4_,quant_param.qmatrix._0_4_),
                       av1_scan_orders[txfm_param.tx_size][txfm_param._0_8_ & 0xff].scan,
                       (int64_t *)(ctxl + 8),(int64_t *)(ctxl + 0x18));
            if ((tx_size != '\x04') || (lVar35 < lVar27)) {
              lVar38 = CONCAT44(ctxl._12_4_,ctxl._8_4_);
              goto LAB_00249264;
            }
            lVar38 = CONCAT44(ctxl._12_4_,ctxl._8_4_);
            if ((lVar35 - ctxl._24_8_) * 2 < (long)ctxl._24_8_) goto LAB_00249264;
            lVar38 = lVar38 + (lVar35 - ctxl._24_8_);
          }
          else {
LAB_00249264:
            iVar23 = dist_block_px_domain(cpi,x,plane,plane_bsize,block,blk_row,blk_col,tx_size);
            if (lVar38 < iVar23) {
              lVar38 = iVar23;
            }
            if (lVar35 < lVar27) {
              lVar38 = iVar23;
            }
          }
          ctxl._8_4_ = (undefined4)lVar38;
          ctxl._12_4_ = (undefined4)((ulong)lVar38 >> 0x20);
          ctxl._24_8_ = lVar35;
          uVar63 = (undefined4)local_6e0;
        }
        else {
          dist_block_tx_domain
                    (x,plane,block,tx_size,
                     (qm_val_t *)CONCAT44(quant_param.qmatrix._4_4_,quant_param.qmatrix._0_4_),
                     av1_scan_orders[txfm_param.tx_size][txfm_param._0_8_ & 0xff].scan,
                     (int64_t *)(ctxl + 8),(int64_t *)(ctxl + 0x18));
          lVar38 = CONCAT44(ctxl._12_4_,ctxl._8_4_);
        }
        ctxl._12_4_ = (undefined4)((ulong)lVar38 >> 0x20);
        ctxl._8_4_ = (undefined4)lVar38;
        ctxl[0] = (undefined1)rate_cost;
        ctxl[1] = rate_cost._1_1_;
        ctxl[2] = rate_cost._2_1_;
        ctxl[3] = rate_cost._3_1_;
        lVar59 = lVar38 * 0x80 + ((long)x->rdmult * (long)rate_cost + 0x100 >> 9);
        lVar27 = local_5f0;
        if (lVar59 < local_5f0) {
          *(ulong *)&best_rd_stats->skip_txfm = (ulong)uStack_5c7 << 8;
          best_rd_stats->rdcost = ctxl._16_8_;
          best_rd_stats->sse = ctxl._24_8_;
          best_rd_stats->rate = rate_cost;
          *(ulong *)&best_rd_stats->zero_rate = CONCAT44(ctxl._8_4_,ctxl._4_4_);
          *(undefined4 *)((long)&best_rd_stats->dist + 4) = ctxl._12_4_;
          local_6c8 = CONCAT71((int7)((ulong)local_6e8->txb_entropy_ctx >> 8),
                               local_6e8->txb_entropy_ctx[block]);
          ptVar61 = local_6e8->dqcoeff;
          local_788._2_6_ = 0;
          local_788._0_2_ = local_6e8->eobs[block];
          local_788._8_8_ = auVar89._8_8_;
          local_6e8->dqcoeff = local_4f0;
          lVar27 = lVar59;
          uVar26 = uVar67;
          local_4f0 = ptVar61;
        }
        uVar31 = (uint8_t)uVar26;
        iVar33 = (cpi->sf).tx_sf.adaptive_txb_search_level;
        if ((iVar33 != 0) && (ref_best_rd < lVar27 - (lVar27 >> ((byte)iVar33 & 0x3f)))) break;
        if (((cpi->sf).tx_sf.tx_type_search.skip_tx_search != 0) && (local_788._0_2_ == 0)) {
          local_788._0_2_ = 0;
          break;
        }
      }
    }
    uVar31 = (uint8_t)uVar26;
    lVar36 = lVar36 + 1;
  } while (lVar36 != 0x10);
  best_rd_stats->skip_txfm = local_788._0_2_ == 0;
  if (plane == 0) {
    iVar33 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[iVar33 * blk_row + blk_col] = uVar31;
    iVar17 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar14 * 4));
    iVar15 = *(int *)((long)tx_size_high_unit + (ulong)(uVar14 * 4));
    if (((0x41010UL >> (uVar55 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar55 & 0x3f) & 1) != 0)) {
      lVar44 = (long)blk_row * (long)iVar33 + (long)blk_col;
      lVar27 = 0;
      do {
        lVar36 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar36 + lVar44] = uVar31;
          lVar36 = lVar36 + 4;
        } while (lVar36 < iVar17);
        lVar27 = lVar27 + 4;
        lVar44 = lVar44 + (long)iVar33 * 4;
      } while (lVar27 < iVar15);
    }
  }
  local_6e8->txb_entropy_ctx[block] = (uint8_t)local_6c8;
  local_6e8->eobs[block] = local_788._0_2_;
  local_6e8->dqcoeff = local_4f0;
  ctxl._8_8_ = lVar38;
  if (((byte)local_718 & local_788._0_2_ != 0) == 1) {
    iVar23 = dist_block_px_domain(cpi,x,plane,plane_bsize,block,blk_row,blk_col,tx_size);
    best_rd_stats->dist = iVar23;
    best_rd_stats->sse = lVar35;
  }
  pMVar4 = *(x->e_mbd).mi;
  if (((((char)*(ushort *)&pMVar4->field_0xa7 < '\0') || (local_788._0_2_ == 0)) ||
      ('\0' < pMVar4->ref_frame[0])) ||
     ((iVar33 = tx_size_high_unit[uVar55],
      (int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [uVar28] <= iVar33 + blk_row &&
      ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [uVar28] <= tx_size_wide_unit[uVar55] + blk_col)))) goto LAB_0024966e;
  uVar13 = x->plane[plane].eobs[block];
  if (uVar13 != 0) {
    bVar66 = (cpi->common).features.reduced_tx_set_used;
    if ((x->e_mbd).lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) {
      if (plane == 0) {
        bVar24 = pMVar4->tx_size;
        if ((0x61810UL >> ((ulong)bVar24 & 0x3f) & 1) != 0) goto LAB_00249611;
        tx_type = (x->e_mbd).tx_type_map[(x->e_mbd).tx_type_map_stride * blk_row + blk_col];
      }
      else {
        uVar26 = (uint)""[av1_ss_size_lookup[pMVar4->bsize][(x->e_mbd).plane[plane].subsampling_x]
                          [(x->e_mbd).plane[plane].subsampling_y]];
        if (uVar26 == 0x10 ||
            ""[av1_ss_size_lookup[pMVar4->bsize][(x->e_mbd).plane[plane].subsampling_x]
               [(x->e_mbd).plane[plane].subsampling_y]] < 0x10) {
          uVar28 = 3;
          if ((1 < uVar26 - 0xb) && (uVar26 != 4)) {
LAB_00249ed6:
            uVar28 = (ulong)uVar26;
          }
        }
        else if (uVar26 == 0x11) {
          uVar28 = 9;
        }
        else {
          if (uVar26 != 0x12) goto LAB_00249ed6;
          uVar28 = 10;
        }
        bVar24 = (byte)uVar28;
        if ((0x61810UL >> (uVar28 & 0x3f) & 1) != 0) goto LAB_00249611;
        if ((0x18608UL >> (uVar28 & 0x3f) & 1) == 0) {
          uVar26 = 2;
          if (bVar66 == false) {
            uVar26 = (uint)av1_ext_tx_set_lookup[0][(0x60604UL >> (uVar28 & 0x3f) & 1) != 0];
          }
        }
        else {
          uVar26 = 0;
        }
        uVar26 = *(uint *)((long)av1_ext_tx_used[0] +
                          (ulong)(byte)intra_mode_to_tx_type__intra_mode_to_tx_type
                                       [(byte)get_uv_mode_uv2y[pMVar4->uv_mode]] * 4 +
                          (ulong)(uVar26 << 6));
        if (uVar26 != 0) {
          uVar26 = (uint)(byte)intra_mode_to_tx_type__intra_mode_to_tx_type
                               [(byte)get_uv_mode_uv2y[pMVar4->uv_mode]];
        }
        tx_type = (uint8_t)uVar26;
      }
    }
    else {
      bVar24 = 0;
LAB_00249611:
      tx_type = '\0';
    }
    iVar17 = (x->e_mbd).plane[plane].dst.stride;
    av1_inverse_transform_block
              (xd,x->plane[plane].dqcoeff + local_6b8,plane,tx_type,bVar24,
               (x->e_mbd).plane[plane].dst.buf + (iVar17 * blk_row + blk_col) * 4,iVar17,
               (uint)uVar13,(uint)bVar66);
  }
  if (((plane == 0) && (uVar31 != '\0')) && (x->plane[plane].eobs[block] == 0)) {
    iVar17 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[iVar17 * blk_row + blk_col] = '\0';
    iVar15 = tx_size_wide_unit[uVar55];
    if (((0x41010UL >> (uVar55 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar55 & 0x3f) & 1) != 0)) {
      lVar44 = (long)blk_row * (long)iVar17 + (long)blk_col;
      lVar38 = 0;
      do {
        lVar27 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar27 + lVar44] = '\0';
          lVar27 = lVar27 + 4;
        } while (lVar27 < iVar15);
        lVar38 = lVar38 + 4;
        lVar44 = lVar44 + (long)iVar17 * 4;
      } while (lVar38 < iVar33);
    }
  }
LAB_0024966e:
  local_6e8->dqcoeff = ptVar5;
  return;
code_r0x0024a173:
  lVar27 = lVar27 + 1;
  if (lVar44 == lVar27) goto LAB_0024a1c2;
  goto LAB_0024a169;
code_r0x0024a5a4:
  uVar60 = uVar60 + 1;
  if (uVar34 == uVar60) goto LAB_0024a5f5;
  goto LAB_0024a59a;
code_r0x00249bb8:
  uVar56 = uVar56 + 1;
  if (uVar60 == uVar56) goto LAB_00249c07;
  goto LAB_00249bae;
}

Assistant:

static void search_tx_type(const AV1_COMP *cpi, MACROBLOCK *x, int plane,
                           int block, int blk_row, int blk_col,
                           BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                           const TXB_CTX *const txb_ctx,
                           FAST_TX_SEARCH_MODE ftxs_mode, int skip_trellis,
                           int64_t ref_best_rd, RD_STATS *best_rd_stats) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  int64_t best_rd = INT64_MAX;
  uint16_t best_eob = 0;
  TX_TYPE best_tx_type = DCT_DCT;
  int rate_cost = 0;
  struct macroblock_plane *const p = &x->plane[plane];
  tran_low_t *orig_dqcoeff = p->dqcoeff;
  tran_low_t *best_dqcoeff = x->dqcoeff_buf;
  const int tx_type_map_idx =
      plane ? 0 : blk_row * xd->tx_type_map_stride + blk_col;
  av1_invalid_rd_stats(best_rd_stats);

  skip_trellis |= !is_trellis_used(cpi->optimize_seg_arr[xd->mi[0]->segment_id],
                                   DRY_RUN_NORMAL);

  uint8_t best_txb_ctx = 0;
  // txk_allowed = TX_TYPES: >1 tx types are allowed
  // txk_allowed < TX_TYPES: only that specific tx type is allowed.
  TX_TYPE txk_allowed = TX_TYPES;
  int txk_map[TX_TYPES] = {
    0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15
  };
  const int dequant_shift = (is_cur_buf_hbd(xd)) ? xd->bd - 5 : 3;
  const int qstep = x->plane[plane].dequant_QTX[1] >> dequant_shift;

  const uint8_t txw = tx_size_wide[tx_size];
  const uint8_t txh = tx_size_high[tx_size];
  int64_t block_sse;
  unsigned int block_mse_q8;
  int dc_only_blk = 0;
  const bool predict_dc_block =
      txfm_params->predict_dc_level >= 1 && txw != 64 && txh != 64;
  int64_t per_px_mean = INT64_MAX;
  if (predict_dc_block) {
    predict_dc_only_block(x, plane, plane_bsize, tx_size, block, blk_row,
                          blk_col, best_rd_stats, &block_sse, &block_mse_q8,
                          &per_px_mean, &dc_only_blk);
    if (best_rd_stats->skip_txfm == 1) {
      const TX_TYPE tx_type = DCT_DCT;
      if (plane == 0) xd->tx_type_map[tx_type_map_idx] = tx_type;
      return;
    }
  } else {
    block_sse = av1_pixel_diff_dist(x, plane, blk_row, blk_col, plane_bsize,
                                    txsize_to_bsize[tx_size], &block_mse_q8);
    assert(block_mse_q8 != UINT_MAX);
  }

  // Bit mask to indicate which transform types are allowed in the RD search.
  uint16_t tx_mask;

  // Use DCT_DCT transform for DC only block.
  if (dc_only_blk || cpi->sf.rt_sf.dct_only_palette_nonrd == 1)
    tx_mask = 1 << DCT_DCT;
  else
    tx_mask = get_tx_mask(cpi, x, plane, block, blk_row, blk_col, plane_bsize,
                          tx_size, txb_ctx, ftxs_mode, ref_best_rd,
                          &txk_allowed, txk_map);
  const uint16_t allowed_tx_mask = tx_mask;

  if (is_cur_buf_hbd(xd)) {
    block_sse = ROUND_POWER_OF_TWO(block_sse, (xd->bd - 8) * 2);
    block_mse_q8 = ROUND_POWER_OF_TWO(block_mse_q8, (xd->bd - 8) * 2);
  }
  block_sse *= 16;
  // Use mse / qstep^2 based threshold logic to take decision of R-D
  // optimization of coeffs. For smaller residuals, coeff optimization
  // would be helpful. For larger residuals, R-D optimization may not be
  // effective.
  // TODO(any): Experiment with variance and mean based thresholds
  const int perform_block_coeff_opt =
      ((uint64_t)block_mse_q8 <=
       (uint64_t)txfm_params->coeff_opt_thresholds[0] * qstep * qstep);
  skip_trellis |= !perform_block_coeff_opt;

  // Flag to indicate if distortion should be calculated in transform domain or
  // not during iterating through transform type candidates.
  // Transform domain distortion is accurate for higher residuals.
  // TODO(any): Experiment with variance and mean based thresholds
  int use_transform_domain_distortion =
      (txfm_params->use_transform_domain_distortion > 0) &&
      (block_mse_q8 >= txfm_params->tx_domain_dist_threshold) &&
      // Any 64-pt transforms only preserves half the coefficients.
      // Therefore transform domain distortion is not valid for these
      // transform sizes.
      (txsize_sqr_up_map[tx_size] != TX_64X64) &&
      // Use pixel domain distortion for DC only blocks
      !dc_only_blk;
  // Flag to indicate if an extra calculation of distortion in the pixel domain
  // should be performed at the end, after the best transform type has been
  // decided.
  int calc_pixel_domain_distortion_final =
      txfm_params->use_transform_domain_distortion == 1 &&
      use_transform_domain_distortion && x->rd_model != LOW_TXFM_RD;
  if (calc_pixel_domain_distortion_final &&
      (txk_allowed < TX_TYPES || allowed_tx_mask == 0x0001))
    calc_pixel_domain_distortion_final = use_transform_domain_distortion = 0;

  const uint16_t *eobs_ptr = x->plane[plane].eobs;

  TxfmParam txfm_param;
  QUANT_PARAM quant_param;
  int skip_trellis_based_on_satd[TX_TYPES] = { 0 };
  av1_setup_xform(cm, x, tx_size, DCT_DCT, &txfm_param);
  av1_setup_quant(tx_size, !skip_trellis,
                  skip_trellis ? (USE_B_QUANT_NO_TRELLIS ? AV1_XFORM_QUANT_B
                                                         : AV1_XFORM_QUANT_FP)
                               : AV1_XFORM_QUANT_FP,
                  cpi->oxcf.q_cfg.quant_b_adapt, &quant_param);

  // Iterate through all transform type candidates.
  for (int idx = 0; idx < TX_TYPES; ++idx) {
    const TX_TYPE tx_type = (TX_TYPE)txk_map[idx];
    if (tx_type == TX_TYPE_INVALID || !check_bit_mask(allowed_tx_mask, tx_type))
      continue;
    txfm_param.tx_type = tx_type;
    if (av1_use_qmatrix(&cm->quant_params, xd, mbmi->segment_id)) {
      av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, tx_type,
                        &quant_param);
    }
    if (plane == 0) xd->tx_type_map[tx_type_map_idx] = tx_type;
    RD_STATS this_rd_stats;
    av1_invalid_rd_stats(&this_rd_stats);

    if (!dc_only_blk)
      av1_xform(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param);
    else
      av1_xform_dc_only(x, plane, block, &txfm_param, per_px_mean);

    skip_trellis_based_on_satd[tx_type] = skip_trellis_opt_based_on_satd(
        x, &quant_param, plane, block, tx_size, cpi->oxcf.q_cfg.quant_b_adapt,
        qstep, txfm_params->coeff_opt_thresholds[1], skip_trellis, dc_only_blk);

    av1_quant(x, plane, block, &txfm_param, &quant_param);

    // Calculate rate cost of quantized coefficients.
    if (quant_param.use_optimize_b) {
      // TODO(aomedia:3209): update Trellis quantization to take into account
      // quantization matrices.
      av1_optimize_b(cpi, x, plane, block, tx_size, tx_type, txb_ctx,
                     &rate_cost);
    } else {
      rate_cost = cost_coeffs(x, plane, block, tx_size, tx_type, txb_ctx,
                              cm->features.reduced_tx_set_used);
    }

    // If rd cost based on coeff rate alone is already more than best_rd,
    // terminate early.
    if (RDCOST(x->rdmult, rate_cost, 0) > best_rd) continue;

    // Calculate distortion.
    if (eobs_ptr[block] == 0) {
      // When eob is 0, pixel domain distortion is more efficient and accurate.
      this_rd_stats.dist = this_rd_stats.sse = block_sse;
    } else if (dc_only_blk) {
      this_rd_stats.sse = block_sse;
      this_rd_stats.dist = dist_block_px_domain(
          cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
    } else if (use_transform_domain_distortion) {
      const SCAN_ORDER *const scan_order =
          get_scan(txfm_param.tx_size, txfm_param.tx_type);
      dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                           scan_order->scan, &this_rd_stats.dist,
                           &this_rd_stats.sse);
    } else {
      int64_t sse_diff = INT64_MAX;
      // high_energy threshold assumes that every pixel within a txfm block
      // has a residue energy of at least 25% of the maximum, i.e. 128 * 128
      // for 8 bit.
      const int64_t high_energy_thresh =
          ((int64_t)128 * 128 * tx_size_2d[tx_size]);
      const int is_high_energy = (block_sse >= high_energy_thresh);
      if (tx_size == TX_64X64 || is_high_energy) {
        // Because 3 out 4 quadrants of transform coefficients are forced to
        // zero, the inverse transform has a tendency to overflow. sse_diff
        // is effectively the energy of those 3 quadrants, here we use it
        // to decide if we should do pixel domain distortion. If the energy
        // is mostly in first quadrant, then it is unlikely that we have
        // overflow issue in inverse transform.
        const SCAN_ORDER *const scan_order =
            get_scan(txfm_param.tx_size, txfm_param.tx_type);
        dist_block_tx_domain(x, plane, block, tx_size, quant_param.qmatrix,
                             scan_order->scan, &this_rd_stats.dist,
                             &this_rd_stats.sse);
        sse_diff = block_sse - this_rd_stats.sse;
      }
      if (tx_size != TX_64X64 || !is_high_energy ||
          (sse_diff * 2) < this_rd_stats.sse) {
        const int64_t tx_domain_dist = this_rd_stats.dist;
        this_rd_stats.dist = dist_block_px_domain(
            cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
        // For high energy blocks, occasionally, the pixel domain distortion
        // can be artificially low due to clamping at reconstruction stage
        // even when inverse transform output is hugely different from the
        // actual residue.
        if (is_high_energy && this_rd_stats.dist < tx_domain_dist)
          this_rd_stats.dist = tx_domain_dist;
      } else {
        assert(sse_diff < INT64_MAX);
        this_rd_stats.dist += sse_diff;
      }
      this_rd_stats.sse = block_sse;
    }

    this_rd_stats.rate = rate_cost;

    const int64_t rd =
        RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);

    if (rd < best_rd) {
      best_rd = rd;
      *best_rd_stats = this_rd_stats;
      best_tx_type = tx_type;
      best_txb_ctx = x->plane[plane].txb_entropy_ctx[block];
      best_eob = x->plane[plane].eobs[block];
      // Swap dqcoeff buffers
      tran_low_t *const tmp_dqcoeff = best_dqcoeff;
      best_dqcoeff = p->dqcoeff;
      p->dqcoeff = tmp_dqcoeff;
    }

#if CONFIG_COLLECT_RD_STATS == 1
    if (plane == 0) {
      PrintTransformUnitStats(cpi, x, &this_rd_stats, blk_row, blk_col,
                              plane_bsize, tx_size, tx_type, rd);
    }
#endif  // CONFIG_COLLECT_RD_STATS == 1

#if COLLECT_TX_SIZE_DATA
    // Generate small sample to restrict output size.
    static unsigned int seed = 21743;
    if (lcg_rand16(&seed) % 200 == 0) {
      FILE *fp = NULL;

      if (within_border) {
        fp = fopen(av1_tx_size_data_output_file, "a");
      }

      if (fp) {
        // Transform info and RD
        const int txb_w = tx_size_wide[tx_size];
        const int txb_h = tx_size_high[tx_size];

        // Residue signal.
        const int diff_stride = block_size_wide[plane_bsize];
        struct macroblock_plane *const p = &x->plane[plane];
        const int16_t *src_diff =
            &p->src_diff[(blk_row * diff_stride + blk_col) * 4];

        for (int r = 0; r < txb_h; ++r) {
          for (int c = 0; c < txb_w; ++c) {
            fprintf(fp, "%d,", src_diff[c]);
          }
          src_diff += diff_stride;
        }

        fprintf(fp, "%d,%d,%d,%" PRId64, txb_w, txb_h, tx_type, rd);
        fprintf(fp, "\n");
        fclose(fp);
      }
    }
#endif  // COLLECT_TX_SIZE_DATA

    // If the current best RD cost is much worse than the reference RD cost,
    // terminate early.
    if (cpi->sf.tx_sf.adaptive_txb_search_level) {
      if ((best_rd - (best_rd >> cpi->sf.tx_sf.adaptive_txb_search_level)) >
          ref_best_rd) {
        break;
      }
    }

    // Terminate transform type search if the block has been quantized to
    // all zero.
    if (cpi->sf.tx_sf.tx_type_search.skip_tx_search && !best_eob) break;
  }

  assert(best_rd != INT64_MAX);

  best_rd_stats->skip_txfm = best_eob == 0;
  if (plane == 0) update_txk_array(xd, blk_row, blk_col, tx_size, best_tx_type);
  x->plane[plane].txb_entropy_ctx[block] = best_txb_ctx;
  x->plane[plane].eobs[block] = best_eob;
  skip_trellis = skip_trellis_based_on_satd[best_tx_type];

  // Point dqcoeff to the quantized coefficients corresponding to the best
  // transform type, then we can skip transform and quantization, e.g. in the
  // final pixel domain distortion calculation and recon_intra().
  p->dqcoeff = best_dqcoeff;

  if (calc_pixel_domain_distortion_final && best_eob) {
    best_rd_stats->dist = dist_block_px_domain(
        cpi, x, plane, plane_bsize, block, blk_row, blk_col, tx_size);
    best_rd_stats->sse = block_sse;
  }

  // Intra mode needs decoded pixels such that the next transform block
  // can use them for prediction.
  recon_intra(cpi, x, plane, block, blk_row, blk_col, plane_bsize, tx_size,
              txb_ctx, skip_trellis, best_tx_type, 0, &rate_cost, best_eob);
  p->dqcoeff = orig_dqcoeff;
}